

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<4,8>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  uint uVar8;
  int iVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined8 uVar56;
  undefined8 uVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  byte bVar60;
  Geometry *geometry;
  long lVar61;
  ulong uVar62;
  ulong uVar63;
  bool bVar64;
  ulong uVar65;
  undefined8 unaff_R13;
  long lVar66;
  ulong uVar67;
  byte bVar68;
  float fVar69;
  float fVar70;
  float fVar119;
  float fVar121;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar80 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar81 [16];
  float fVar120;
  float fVar122;
  float fVar124;
  float fVar125;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar123;
  float fVar126;
  float fVar127;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined4 uVar128;
  float fVar133;
  float fVar134;
  vint4 bi_2;
  float fVar135;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined8 uVar136;
  vint4 bi_1;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  float fVar144;
  vint4 ai_2;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  vint4 bi;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  vint4 ai;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar168;
  float fVar172;
  vint4 ai_1;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  uint uVar179;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  RTCFilterFunctionNArguments args;
  RTCFilterFunctionNArguments local_630;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  LinearSpace3fa *local_510;
  ulong local_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined8 local_440;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  uint local_400;
  uint uStack_3fc;
  uint uStack_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  int local_35c;
  undefined1 local_350 [16];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar67 = (ulong)(byte)prim[1];
  fVar144 = *(float *)(prim + uVar67 * 0x19 + 0x12);
  auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar78 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar77 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar77 = vinsertps_avx(auVar77,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar78 = vsubps_avx(auVar78,*(undefined1 (*) [16])(prim + uVar67 * 0x19 + 6));
  auVar145._0_4_ = fVar144 * auVar78._0_4_;
  auVar145._4_4_ = fVar144 * auVar78._4_4_;
  auVar145._8_4_ = fVar144 * auVar78._8_4_;
  auVar145._12_4_ = fVar144 * auVar78._12_4_;
  auVar80._0_4_ = fVar144 * auVar77._0_4_;
  auVar80._4_4_ = fVar144 * auVar77._4_4_;
  auVar80._8_4_ = fVar144 * auVar77._8_4_;
  auVar80._12_4_ = fVar144 * auVar77._12_4_;
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 4 + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 5 + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 6 + 6)));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xb + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xc + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xd + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x12 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x13 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x14 + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar181._4_4_ = auVar80._0_4_;
  auVar181._0_4_ = auVar80._0_4_;
  auVar181._8_4_ = auVar80._0_4_;
  auVar181._12_4_ = auVar80._0_4_;
  auVar79 = vshufps_avx(auVar80,auVar80,0x55);
  auVar74 = vshufps_avx(auVar80,auVar80,0xaa);
  fVar144 = auVar74._0_4_;
  auVar155._0_4_ = fVar144 * auVar71._0_4_;
  fVar133 = auVar74._4_4_;
  auVar155._4_4_ = fVar133 * auVar71._4_4_;
  fVar134 = auVar74._8_4_;
  auVar155._8_4_ = fVar134 * auVar71._8_4_;
  fVar135 = auVar74._12_4_;
  auVar155._12_4_ = fVar135 * auVar71._12_4_;
  auVar137._0_4_ = auVar72._0_4_ * fVar144;
  auVar137._4_4_ = auVar72._4_4_ * fVar133;
  auVar137._8_4_ = auVar72._8_4_ * fVar134;
  auVar137._12_4_ = auVar72._12_4_ * fVar135;
  auVar129._0_4_ = auVar73._0_4_ * fVar144;
  auVar129._4_4_ = auVar73._4_4_ * fVar133;
  auVar129._8_4_ = auVar73._8_4_ * fVar134;
  auVar129._12_4_ = auVar73._12_4_ * fVar135;
  auVar74 = vfmadd231ps_fma(auVar155,auVar79,auVar77);
  auVar76 = vfmadd231ps_fma(auVar137,auVar79,auVar21);
  auVar79 = vfmadd231ps_fma(auVar129,auVar23,auVar79);
  auVar75 = vfmadd231ps_fma(auVar74,auVar181,auVar78);
  auVar76 = vfmadd231ps_fma(auVar76,auVar181,auVar20);
  auVar80 = vfmadd231ps_fma(auVar79,auVar22,auVar181);
  auVar182._4_4_ = auVar145._0_4_;
  auVar182._0_4_ = auVar145._0_4_;
  auVar182._8_4_ = auVar145._0_4_;
  auVar182._12_4_ = auVar145._0_4_;
  auVar79 = vshufps_avx(auVar145,auVar145,0x55);
  auVar74 = vshufps_avx(auVar145,auVar145,0xaa);
  auVar71 = vmulps_avx512vl(auVar74,auVar71);
  auVar146._0_4_ = auVar74._0_4_ * auVar72._0_4_;
  auVar146._4_4_ = auVar74._4_4_ * auVar72._4_4_;
  auVar146._8_4_ = auVar74._8_4_ * auVar72._8_4_;
  auVar146._12_4_ = auVar74._12_4_ * auVar72._12_4_;
  auVar81._0_4_ = auVar74._0_4_ * auVar73._0_4_;
  auVar81._4_4_ = auVar74._4_4_ * auVar73._4_4_;
  auVar81._8_4_ = auVar74._8_4_ * auVar73._8_4_;
  auVar81._12_4_ = auVar74._12_4_ * auVar73._12_4_;
  auVar72 = vfmadd231ps_avx512vl(auVar71,auVar79,auVar77);
  auVar77 = vfmadd231ps_fma(auVar146,auVar79,auVar21);
  auVar71 = vfmadd231ps_fma(auVar81,auVar79,auVar23);
  auVar73 = vfmadd231ps_avx512vl(auVar72,auVar182,auVar78);
  auVar72 = vfmadd231ps_fma(auVar77,auVar182,auVar20);
  auVar173._8_4_ = 0x7fffffff;
  auVar173._0_8_ = 0x7fffffff7fffffff;
  auVar173._12_4_ = 0x7fffffff;
  auVar23 = vfmadd231ps_fma(auVar71,auVar182,auVar22);
  auVar78 = vandps_avx(auVar75,auVar173);
  auVar169._8_4_ = 0x219392ef;
  auVar169._0_8_ = 0x219392ef219392ef;
  auVar169._12_4_ = 0x219392ef;
  uVar63 = vcmpps_avx512vl(auVar78,auVar169,1);
  bVar64 = (bool)((byte)uVar63 & 1);
  auVar74._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar75._0_4_;
  bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar75._4_4_;
  bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar75._8_4_;
  bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar75._12_4_;
  auVar78 = vandps_avx(auVar76,auVar173);
  uVar63 = vcmpps_avx512vl(auVar78,auVar169,1);
  bVar64 = (bool)((byte)uVar63 & 1);
  auVar75._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar76._0_4_;
  bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
  auVar75._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar76._4_4_;
  bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
  auVar75._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar76._8_4_;
  bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
  auVar75._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar76._12_4_;
  auVar78 = vandps_avx(auVar80,auVar173);
  uVar63 = vcmpps_avx512vl(auVar78,auVar169,1);
  bVar64 = (bool)((byte)uVar63 & 1);
  auVar76._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar80._0_4_;
  bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
  auVar76._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar80._4_4_;
  bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
  auVar76._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar80._8_4_;
  bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
  auVar76._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar80._12_4_;
  auVar77 = vrcp14ps_avx512vl(auVar74);
  auVar170._8_4_ = 0x3f800000;
  auVar170._0_8_ = 0x3f8000003f800000;
  auVar170._12_4_ = 0x3f800000;
  auVar78 = vfnmadd213ps_fma(auVar74,auVar77,auVar170);
  auVar71 = vfmadd132ps_fma(auVar78,auVar77,auVar77);
  auVar77 = vrcp14ps_avx512vl(auVar75);
  auVar78 = vfnmadd213ps_fma(auVar75,auVar77,auVar170);
  auVar21 = vfmadd132ps_fma(auVar78,auVar77,auVar77);
  auVar77 = vrcp14ps_avx512vl(auVar76);
  auVar78 = vfnmadd213ps_fma(auVar76,auVar77,auVar170);
  auVar22 = vfmadd132ps_fma(auVar78,auVar77,auVar77);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar67 * 7 + 6);
  auVar78 = vpmovsxwd_avx(auVar78);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx512vl(auVar78,auVar73);
  auVar163._0_4_ = auVar71._0_4_ * auVar78._0_4_;
  auVar163._4_4_ = auVar71._4_4_ * auVar78._4_4_;
  auVar163._8_4_ = auVar71._8_4_ * auVar78._8_4_;
  auVar163._12_4_ = auVar71._12_4_ * auVar78._12_4_;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar67 * 9 + 6);
  auVar78 = vpmovsxwd_avx(auVar77);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx512vl(auVar78,auVar73);
  auVar156._0_4_ = auVar71._0_4_ * auVar78._0_4_;
  auVar156._4_4_ = auVar71._4_4_ * auVar78._4_4_;
  auVar156._8_4_ = auVar71._8_4_ * auVar78._8_4_;
  auVar156._12_4_ = auVar71._12_4_ * auVar78._12_4_;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar67 * 0xe + 6);
  auVar78 = vpmovsxwd_avx(auVar71);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar72);
  auVar171._0_4_ = auVar21._0_4_ * auVar78._0_4_;
  auVar171._4_4_ = auVar21._4_4_ * auVar78._4_4_;
  auVar171._8_4_ = auVar21._8_4_ * auVar78._8_4_;
  auVar171._12_4_ = auVar21._12_4_ * auVar78._12_4_;
  auVar71 = vpbroadcastd_avx512vl();
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar78 = vpmovsxwd_avx(auVar20);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar72);
  auVar138._0_4_ = auVar21._0_4_ * auVar78._0_4_;
  auVar138._4_4_ = auVar21._4_4_ * auVar78._4_4_;
  auVar138._8_4_ = auVar21._8_4_ * auVar78._8_4_;
  auVar138._12_4_ = auVar21._12_4_ * auVar78._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar67 * 0x15 + 6);
  auVar78 = vpmovsxwd_avx(auVar21);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar23);
  auVar147._0_4_ = auVar22._0_4_ * auVar78._0_4_;
  auVar147._4_4_ = auVar22._4_4_ * auVar78._4_4_;
  auVar147._8_4_ = auVar22._8_4_ * auVar78._8_4_;
  auVar147._12_4_ = auVar22._12_4_ * auVar78._12_4_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar67 * 0x17 + 6);
  auVar78 = vpmovsxwd_avx(auVar72);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar23);
  auVar130._0_4_ = auVar22._0_4_ * auVar78._0_4_;
  auVar130._4_4_ = auVar22._4_4_ * auVar78._4_4_;
  auVar130._8_4_ = auVar22._8_4_ * auVar78._8_4_;
  auVar130._12_4_ = auVar22._12_4_ * auVar78._12_4_;
  auVar78 = vpminsd_avx(auVar163,auVar156);
  auVar77 = vpminsd_avx(auVar171,auVar138);
  auVar78 = vmaxps_avx(auVar78,auVar77);
  auVar77 = vpminsd_avx(auVar147,auVar130);
  uVar128 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar22._4_4_ = uVar128;
  auVar22._0_4_ = uVar128;
  auVar22._8_4_ = uVar128;
  auVar22._12_4_ = uVar128;
  auVar77 = vmaxps_avx512vl(auVar77,auVar22);
  auVar78 = vmaxps_avx(auVar78,auVar77);
  auVar23._8_4_ = 0x3f7ffffa;
  auVar23._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar23._12_4_ = 0x3f7ffffa;
  local_3d0 = vmulps_avx512vl(auVar78,auVar23);
  auVar78 = vpmaxsd_avx(auVar163,auVar156);
  auVar77 = vpmaxsd_avx(auVar171,auVar138);
  auVar78 = vminps_avx(auVar78,auVar77);
  auVar77 = vpmaxsd_avx(auVar147,auVar130);
  uVar128 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar73._4_4_ = uVar128;
  auVar73._0_4_ = uVar128;
  auVar73._8_4_ = uVar128;
  auVar73._12_4_ = uVar128;
  auVar77 = vminps_avx512vl(auVar77,auVar73);
  auVar78 = vminps_avx(auVar78,auVar77);
  auVar79._8_4_ = 0x3f800003;
  auVar79._0_8_ = 0x3f8000033f800003;
  auVar79._12_4_ = 0x3f800003;
  auVar78 = vmulps_avx512vl(auVar78,auVar79);
  uVar24 = vcmpps_avx512vl(local_3d0,auVar78,2);
  uVar26 = vpcmpgtd_avx512vl(auVar71,_DAT_01f4ad30);
  local_508 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)((byte)uVar24 & 0xf & (byte)uVar26));
  local_510 = pre->ray_space + k;
  local_2a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  while (auVar94 = local_420, local_508 != 0) {
    lVar66 = 0;
    for (uVar63 = local_508; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
      lVar66 = lVar66 + 1;
    }
    uVar8 = *(uint *)(prim + 2);
    pGVar10 = (context->scene->geometries).items[uVar8].ptr;
    uVar63 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                             pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * (ulong)*(uint *)(prim + lVar66 * 4 + 6));
    p_Var11 = pGVar10[1].intersectionFilterN;
    lVar66 = *(long *)&pGVar10[1].time_range.upper;
    auVar78 = *(undefined1 (*) [16])(lVar66 + (long)p_Var11 * uVar63);
    pauVar3 = (undefined1 (*) [16])(lVar66 + (uVar63 + 1) * (long)p_Var11);
    uVar24 = *(undefined8 *)*pauVar3;
    uVar26 = *(undefined8 *)(*pauVar3 + 8);
    auVar22 = *pauVar3;
    auVar21 = *pauVar3;
    auVar77 = *pauVar3;
    pauVar4 = (undefined1 (*) [16])(lVar66 + (uVar63 + 2) * (long)p_Var11);
    uVar56 = *(undefined8 *)*pauVar4;
    uVar57 = *(undefined8 *)(*pauVar4 + 8);
    auVar72 = *pauVar4;
    auVar20 = *pauVar4;
    auVar71 = *pauVar4;
    uVar67 = local_508 - 1 & local_508;
    pauVar5 = (undefined1 (*) [12])(lVar66 + (uVar63 + 3) * (long)p_Var11);
    local_520 = (float)*(undefined8 *)*pauVar5;
    fStack_51c = (float)((ulong)*(undefined8 *)*pauVar5 >> 0x20);
    fStack_518 = (float)*(undefined8 *)(*pauVar5 + 8);
    fStack_514 = (float)((ulong)*(undefined8 *)(*pauVar5 + 8) >> 0x20);
    if (uVar67 != 0) {
      uVar65 = uVar67 - 1 & uVar67;
      for (uVar63 = uVar67; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
      }
      if (uVar65 != 0) {
        for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar9 = (int)pGVar10[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar23 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar23 = vinsertps_avx(auVar23,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar79 = vsubps_avx(auVar78,auVar23);
    uVar128 = auVar79._0_4_;
    auVar142._4_4_ = uVar128;
    auVar142._0_4_ = uVar128;
    auVar142._8_4_ = uVar128;
    auVar142._12_4_ = uVar128;
    auVar73 = vshufps_avx(auVar79,auVar79,0x55);
    auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
    aVar6 = (local_510->vx).field_0;
    aVar7 = (local_510->vy).field_0;
    fVar144 = (local_510->vz).field_0.m128[0];
    fVar133 = *(float *)((long)&(local_510->vz).field_0 + 4);
    fVar134 = *(float *)((long)&(local_510->vz).field_0 + 8);
    fVar135 = *(float *)((long)&(local_510->vz).field_0 + 0xc);
    auVar176._0_4_ = fVar144 * auVar79._0_4_;
    auVar176._4_4_ = fVar133 * auVar79._4_4_;
    auVar176._8_4_ = fVar134 * auVar79._8_4_;
    auVar176._12_4_ = fVar135 * auVar79._12_4_;
    auVar73 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar7,auVar73);
    auVar76 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar6,auVar142);
    auVar73 = vshufps_avx(auVar78,auVar78,0xff);
    auVar74 = vsubps_avx(auVar77,auVar23);
    uVar128 = auVar74._0_4_;
    auVar148._4_4_ = uVar128;
    auVar148._0_4_ = uVar128;
    auVar148._8_4_ = uVar128;
    auVar148._12_4_ = uVar128;
    auVar79 = vshufps_avx(auVar74,auVar74,0x55);
    auVar74 = vshufps_avx(auVar74,auVar74,0xaa);
    auVar177._0_4_ = fVar144 * auVar74._0_4_;
    auVar177._4_4_ = fVar133 * auVar74._4_4_;
    auVar177._8_4_ = fVar134 * auVar74._8_4_;
    auVar177._12_4_ = fVar135 * auVar74._12_4_;
    auVar79 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar7,auVar79);
    auVar75 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar6,auVar148);
    auVar77 = vshufps_avx(auVar77,auVar77,0xff);
    auVar74 = vsubps_avx(auVar71,auVar23);
    uVar128 = auVar74._0_4_;
    auVar174._4_4_ = uVar128;
    auVar174._0_4_ = uVar128;
    auVar174._8_4_ = uVar128;
    auVar174._12_4_ = uVar128;
    auVar79 = vshufps_avx(auVar74,auVar74,0x55);
    auVar74 = vshufps_avx(auVar74,auVar74,0xaa);
    auVar180._0_4_ = fVar144 * auVar74._0_4_;
    auVar180._4_4_ = fVar133 * auVar74._4_4_;
    auVar180._8_4_ = fVar134 * auVar74._8_4_;
    auVar180._12_4_ = fVar135 * auVar74._12_4_;
    auVar79 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar7,auVar79);
    auVar74 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar6,auVar174);
    auVar71 = vshufps_avx(auVar71,auVar71,0xff);
    auVar58._12_4_ = fStack_514;
    auVar58._0_12_ = *pauVar5;
    auVar79 = vsubps_avx512vl(auVar58,auVar23);
    uVar128 = auVar79._0_4_;
    auVar149._4_4_ = uVar128;
    auVar149._0_4_ = uVar128;
    auVar149._8_4_ = uVar128;
    auVar149._12_4_ = uVar128;
    auVar23 = vshufps_avx(auVar79,auVar79,0x55);
    auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
    auVar183._0_4_ = fVar144 * auVar79._0_4_;
    auVar183._4_4_ = fVar133 * auVar79._4_4_;
    auVar183._8_4_ = fVar134 * auVar79._8_4_;
    auVar183._12_4_ = fVar135 * auVar79._12_4_;
    auVar23 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar7,auVar23);
    auVar23 = vfmadd231ps_fma(auVar23,(undefined1  [16])aVar6,auVar149);
    auVar79 = vshufps_avx512vl(auVar58,auVar58,0xff);
    lVar66 = (long)iVar9 * 0x44;
    auVar96 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar66);
    local_4c0 = vbroadcastss_avx512vl(auVar76);
    auVar82._8_4_ = 1;
    auVar82._0_8_ = 0x100000001;
    auVar82._12_4_ = 1;
    auVar82._16_4_ = 1;
    auVar82._20_4_ = 1;
    auVar82._24_4_ = 1;
    auVar82._28_4_ = 1;
    local_4a0 = vpermps_avx512vl(auVar82,ZEXT1632(auVar76));
    uVar136 = auVar73._0_8_;
    local_80._8_8_ = uVar136;
    local_80._0_8_ = uVar136;
    local_80._16_8_ = uVar136;
    local_80._24_8_ = uVar136;
    auVar100 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar66 + 0x484);
    uVar128 = auVar75._0_4_;
    local_600._4_4_ = uVar128;
    local_600._0_4_ = uVar128;
    local_600._8_4_ = uVar128;
    local_600._12_4_ = uVar128;
    local_600._16_4_ = uVar128;
    local_600._20_4_ = uVar128;
    local_600._24_4_ = uVar128;
    local_600._28_4_ = uVar128;
    local_5e0 = vpermps_avx512vl(auVar82,ZEXT1632(auVar75));
    uVar136 = auVar77._0_8_;
    local_a0._8_8_ = uVar136;
    local_a0._0_8_ = uVar136;
    local_a0._16_8_ = uVar136;
    local_a0._24_8_ = uVar136;
    auVar98 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar66 + 0x908);
    local_580 = vbroadcastss_avx512vl(auVar74);
    local_4e0 = vpermps_avx2(auVar82,ZEXT1632(auVar74));
    local_c0 = vbroadcastsd_avx512vl(auVar71);
    auVar97 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar66 + 0xd8c);
    local_5a0 = vbroadcastss_avx512vl(auVar23);
    auVar193 = ZEXT3264(local_5a0);
    local_5c0 = vpermps_avx512vl(auVar82,ZEXT1632(auVar23));
    auVar195 = ZEXT3264(local_5c0);
    _local_e0 = vbroadcastsd_avx512vl(auVar79);
    auVar82 = vmulps_avx512vl(local_5a0,auVar97);
    auVar83 = vmulps_avx512vl(local_5c0,auVar97);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar98,local_580);
    auVar77 = vfmadd231ps_fma(auVar83,auVar98,local_4e0);
    auVar71 = vfmadd231ps_fma(auVar82,auVar100,local_600);
    auVar82 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar100,local_5e0);
    auVar84 = vfmadd231ps_avx512vl(ZEXT1632(auVar71),auVar96,local_4c0);
    auVar85 = vfmadd231ps_avx512vl(auVar82,auVar96,local_4a0);
    auVar82 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar66);
    auVar83 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar66 + 0x484);
    auVar99 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar66 + 0x908);
    auVar95 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar66 + 0xd8c);
    auVar86 = vmulps_avx512vl(local_5a0,auVar95);
    auVar87 = vmulps_avx512vl(local_5c0,auVar95);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar99,local_580);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar99,local_4e0);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar83,local_600);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar83,local_5e0);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar82,local_4c0);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar82,local_4a0);
    auVar88 = vsubps_avx512vl(auVar86,auVar84);
    auVar89 = vsubps_avx512vl(auVar87,auVar85);
    auVar90 = vmulps_avx512vl(auVar85,auVar88);
    auVar91 = vmulps_avx512vl(auVar84,auVar89);
    auVar90 = vsubps_avx512vl(auVar90,auVar91);
    auVar91 = vmulps_avx512vl(_local_e0,auVar97);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar98,local_c0);
    auVar77 = vfmadd231ps_fma(auVar91,auVar100,local_a0);
    auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar96,local_80);
    auVar92 = vmulps_avx512vl(_local_e0,auVar95);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar99,local_c0);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar83,local_a0);
    auVar73 = vfmadd231ps_fma(auVar92,auVar82,local_80);
    auVar92 = vmulps_avx512vl(auVar89,auVar89);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar88,auVar88);
    auVar93 = vmaxps_avx512vl(auVar91,ZEXT1632(auVar73));
    auVar93 = vmulps_avx512vl(auVar93,auVar93);
    auVar92 = vmulps_avx512vl(auVar93,auVar92);
    auVar90 = vmulps_avx512vl(auVar90,auVar90);
    uVar136 = vcmpps_avx512vl(auVar90,auVar92,2);
    auVar77 = vblendps_avx(auVar76,auVar78,8);
    auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar71 = vandps_avx512vl(auVar77,auVar79);
    auVar77 = vblendps_avx(auVar75,*pauVar3,8);
    auVar77 = vandps_avx512vl(auVar77,auVar79);
    auVar71 = vmaxps_avx(auVar71,auVar77);
    auVar77 = vblendps_avx(auVar74,*pauVar4,8);
    auVar80 = vandps_avx512vl(auVar77,auVar79);
    auVar77 = vblendps_avx(auVar23,auVar58,8);
    auVar77 = vandps_avx512vl(auVar77,auVar79);
    auVar77 = vmaxps_avx(auVar80,auVar77);
    auVar77 = vmaxps_avx(auVar71,auVar77);
    auVar71 = vmovshdup_avx(auVar77);
    auVar71 = vmaxss_avx(auVar71,auVar77);
    auVar77 = vshufpd_avx(auVar77,auVar77,1);
    local_420._0_4_ = (undefined4)iVar9;
    local_420._4_12_ = auVar76._4_12_;
    auVar77 = vmaxss_avx(auVar77,auVar71);
    local_420._16_16_ = auVar94._16_16_;
    auVar90._4_4_ = local_420._0_4_;
    auVar90._0_4_ = local_420._0_4_;
    auVar90._8_4_ = local_420._0_4_;
    auVar90._12_4_ = local_420._0_4_;
    auVar90._16_4_ = local_420._0_4_;
    auVar90._20_4_ = local_420._0_4_;
    auVar90._24_4_ = local_420._0_4_;
    auVar90._28_4_ = local_420._0_4_;
    uVar25 = vcmpps_avx512vl(auVar90,_DAT_01f7b060,0xe);
    bVar68 = (byte)uVar136 & (byte)uVar25;
    auVar77 = vmulss_avx512f(auVar77,ZEXT416(0x35000000));
    auVar94._8_4_ = 2;
    auVar94._0_8_ = 0x200000002;
    auVar94._12_4_ = 2;
    auVar94._16_4_ = 2;
    auVar94._20_4_ = 2;
    auVar94._24_4_ = 2;
    auVar94._28_4_ = 2;
    local_100 = vpermps_avx512vl(auVar94,ZEXT1632(auVar76));
    local_120 = vpermps_avx512vl(auVar94,ZEXT1632(auVar75));
    local_140 = vpermps_avx512vl(auVar94,ZEXT1632(auVar74));
    local_560 = vpermps_avx2(auVar94,ZEXT1632(auVar23));
    uVar179 = *(uint *)(ray + k * 4 + 0x60);
    local_280 = vpbroadcastd_avx512vl();
    auVar71 = local_100._0_16_;
    if (bVar68 == 0) {
      bVar64 = false;
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar188 = ZEXT3264(auVar94);
      auVar71 = vxorps_avx512vl(auVar71,auVar71);
      auVar189 = ZEXT1664(auVar71);
      auVar190 = ZEXT3264(local_4c0);
      auVar191 = ZEXT3264(local_4a0);
      auVar187 = ZEXT3264(local_600);
      auVar186 = ZEXT3264(local_5e0);
      auVar192 = ZEXT3264(local_580);
      auVar194 = ZEXT3264(local_4e0);
    }
    else {
      local_500._0_16_ = ZEXT416(uVar179);
      local_480._0_16_ = auVar77;
      auVar94 = vmulps_avx512vl(local_560,auVar95);
      auVar94 = vfmadd213ps_avx512vl(auVar99,local_140,auVar94);
      auVar94 = vfmadd213ps_avx512vl(auVar83,local_120,auVar94);
      auVar82 = vfmadd213ps_avx512vl(auVar82,local_100,auVar94);
      auVar94 = vmulps_avx512vl(local_560,auVar97);
      auVar94 = vfmadd213ps_avx512vl(auVar98,local_140,auVar94);
      auVar83 = vfmadd213ps_avx512vl(auVar100,local_120,auVar94);
      auVar94 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar66 + 0x1210);
      auVar100 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar66 + 0x1694);
      auVar98 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar66 + 0x1b18);
      auVar97 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar66 + 0x1f9c);
      auVar95 = vfmadd213ps_avx512vl(auVar96,local_100,auVar83);
      auVar96 = vmulps_avx512vl(local_5a0,auVar97);
      auVar83 = vmulps_avx512vl(local_5c0,auVar97);
      auVar97 = vmulps_avx512vl(local_560,auVar97);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar98,local_580);
      auVar23 = vfmadd231ps_fma(auVar83,auVar98,local_4e0);
      auVar98 = vfmadd231ps_avx512vl(auVar97,local_140,auVar98);
      auVar79 = vfmadd231ps_fma(auVar96,auVar100,local_600);
      auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar23),auVar100,local_5e0);
      auVar97 = vfmadd231ps_avx512vl(auVar98,local_120,auVar100);
      auVar83 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar94,local_4c0);
      auVar99 = vfmadd231ps_avx512vl(auVar96,auVar94,local_4a0);
      auVar96 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar66 + 0x1210);
      auVar100 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar66 + 0x1b18);
      auVar98 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar66 + 0x1f9c);
      auVar97 = vfmadd231ps_avx512vl(auVar97,local_100,auVar94);
      auVar94 = vmulps_avx512vl(local_5a0,auVar98);
      auVar90 = vmulps_avx512vl(local_5c0,auVar98);
      auVar98 = vmulps_avx512vl(local_560,auVar98);
      auVar196 = ZEXT1664(auVar77);
      auVar92 = vfmadd231ps_avx512vl(auVar94,auVar100,local_580);
      auVar23 = vfmadd231ps_fma(auVar90,auVar100,local_4e0);
      auVar194 = ZEXT3264(local_4e0);
      auVar100 = vfmadd231ps_avx512vl(auVar98,local_140,auVar100);
      auVar94 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar66 + 0x1694);
      auVar98 = vfmadd231ps_avx512vl(auVar92,auVar94,local_600);
      auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar23),auVar94,local_5e0);
      auVar94 = vfmadd231ps_avx512vl(auVar100,local_120,auVar94);
      auVar100 = vfmadd231ps_avx512vl(auVar98,auVar96,local_4c0);
      auVar98 = vfmadd231ps_avx512vl(auVar90,auVar96,local_4a0);
      auVar90 = vfmadd231ps_avx512vl(auVar94,local_100,auVar96);
      auVar184._8_4_ = 0x7fffffff;
      auVar184._0_8_ = 0x7fffffff7fffffff;
      auVar184._12_4_ = 0x7fffffff;
      auVar184._16_4_ = 0x7fffffff;
      auVar184._20_4_ = 0x7fffffff;
      auVar184._24_4_ = 0x7fffffff;
      auVar184._28_4_ = 0x7fffffff;
      auVar94 = vandps_avx(auVar83,auVar184);
      auVar96 = vandps_avx(auVar99,auVar184);
      auVar96 = vmaxps_avx(auVar94,auVar96);
      auVar94 = vandps_avx(auVar97,auVar184);
      auVar94 = vmaxps_avx(auVar96,auVar94);
      auVar97 = vbroadcastss_avx512vl(auVar77);
      uVar63 = vcmpps_avx512vl(auVar94,auVar97,1);
      bVar64 = (bool)((byte)uVar63 & 1);
      auVar92._0_4_ = (float)((uint)bVar64 * auVar88._0_4_ | (uint)!bVar64 * auVar83._0_4_);
      bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar92._4_4_ = (float)((uint)bVar64 * auVar88._4_4_ | (uint)!bVar64 * auVar83._4_4_);
      bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar92._8_4_ = (float)((uint)bVar64 * auVar88._8_4_ | (uint)!bVar64 * auVar83._8_4_);
      bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar92._12_4_ = (float)((uint)bVar64 * auVar88._12_4_ | (uint)!bVar64 * auVar83._12_4_);
      bVar64 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar92._16_4_ = (float)((uint)bVar64 * auVar88._16_4_ | (uint)!bVar64 * auVar83._16_4_);
      bVar64 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar92._20_4_ = (float)((uint)bVar64 * auVar88._20_4_ | (uint)!bVar64 * auVar83._20_4_);
      bVar64 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar92._24_4_ = (float)((uint)bVar64 * auVar88._24_4_ | (uint)!bVar64 * auVar83._24_4_);
      bVar64 = SUB81(uVar63 >> 7,0);
      auVar92._28_4_ = (uint)bVar64 * auVar88._28_4_ | (uint)!bVar64 * auVar83._28_4_;
      bVar64 = (bool)((byte)uVar63 & 1);
      auVar93._0_4_ = (float)((uint)bVar64 * auVar89._0_4_ | (uint)!bVar64 * auVar99._0_4_);
      bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar93._4_4_ = (float)((uint)bVar64 * auVar89._4_4_ | (uint)!bVar64 * auVar99._4_4_);
      bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar93._8_4_ = (float)((uint)bVar64 * auVar89._8_4_ | (uint)!bVar64 * auVar99._8_4_);
      bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar93._12_4_ = (float)((uint)bVar64 * auVar89._12_4_ | (uint)!bVar64 * auVar99._12_4_);
      bVar64 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar93._16_4_ = (float)((uint)bVar64 * auVar89._16_4_ | (uint)!bVar64 * auVar99._16_4_);
      bVar64 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar93._20_4_ = (float)((uint)bVar64 * auVar89._20_4_ | (uint)!bVar64 * auVar99._20_4_);
      bVar64 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar93._24_4_ = (float)((uint)bVar64 * auVar89._24_4_ | (uint)!bVar64 * auVar99._24_4_);
      bVar64 = SUB81(uVar63 >> 7,0);
      auVar93._28_4_ = (uint)bVar64 * auVar89._28_4_ | (uint)!bVar64 * auVar99._28_4_;
      auVar94 = vandps_avx(auVar184,auVar100);
      auVar96 = vandps_avx(auVar98,auVar184);
      auVar96 = vmaxps_avx(auVar94,auVar96);
      auVar94 = vandps_avx(auVar90,auVar184);
      auVar94 = vmaxps_avx(auVar96,auVar94);
      uVar63 = vcmpps_avx512vl(auVar94,auVar97,1);
      bVar64 = (bool)((byte)uVar63 & 1);
      auVar101._0_4_ = (float)((uint)bVar64 * auVar88._0_4_ | (uint)!bVar64 * auVar100._0_4_);
      bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar101._4_4_ = (float)((uint)bVar64 * auVar88._4_4_ | (uint)!bVar64 * auVar100._4_4_);
      bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar101._8_4_ = (float)((uint)bVar64 * auVar88._8_4_ | (uint)!bVar64 * auVar100._8_4_);
      bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar101._12_4_ = (float)((uint)bVar64 * auVar88._12_4_ | (uint)!bVar64 * auVar100._12_4_);
      bVar64 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar101._16_4_ = (float)((uint)bVar64 * auVar88._16_4_ | (uint)!bVar64 * auVar100._16_4_);
      bVar64 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar101._20_4_ = (float)((uint)bVar64 * auVar88._20_4_ | (uint)!bVar64 * auVar100._20_4_);
      bVar64 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar101._24_4_ = (float)((uint)bVar64 * auVar88._24_4_ | (uint)!bVar64 * auVar100._24_4_);
      bVar64 = SUB81(uVar63 >> 7,0);
      auVar101._28_4_ = (uint)bVar64 * auVar88._28_4_ | (uint)!bVar64 * auVar100._28_4_;
      bVar64 = (bool)((byte)uVar63 & 1);
      auVar88._0_4_ = (float)((uint)bVar64 * auVar89._0_4_ | (uint)!bVar64 * auVar98._0_4_);
      bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar88._4_4_ = (float)((uint)bVar64 * auVar89._4_4_ | (uint)!bVar64 * auVar98._4_4_);
      bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar88._8_4_ = (float)((uint)bVar64 * auVar89._8_4_ | (uint)!bVar64 * auVar98._8_4_);
      bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar88._12_4_ = (float)((uint)bVar64 * auVar89._12_4_ | (uint)!bVar64 * auVar98._12_4_);
      bVar64 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar88._16_4_ = (float)((uint)bVar64 * auVar89._16_4_ | (uint)!bVar64 * auVar98._16_4_);
      bVar64 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar88._20_4_ = (float)((uint)bVar64 * auVar89._20_4_ | (uint)!bVar64 * auVar98._20_4_);
      bVar64 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar88._24_4_ = (float)((uint)bVar64 * auVar89._24_4_ | (uint)!bVar64 * auVar98._24_4_);
      bVar64 = SUB81(uVar63 >> 7,0);
      auVar88._28_4_ = (uint)bVar64 * auVar89._28_4_ | (uint)!bVar64 * auVar98._28_4_;
      auVar81 = vxorps_avx512vl(auVar71,auVar71);
      auVar189 = ZEXT1664(auVar81);
      auVar94 = vfmadd213ps_avx512vl(auVar92,auVar92,ZEXT1632(auVar81));
      auVar71 = vfmadd231ps_fma(auVar94,auVar93,auVar93);
      auVar94 = vrsqrt14ps_avx512vl(ZEXT1632(auVar71));
      fVar144 = auVar94._0_4_;
      fVar133 = auVar94._4_4_;
      fVar134 = auVar94._8_4_;
      fVar135 = auVar94._12_4_;
      fVar168 = auVar94._16_4_;
      fVar172 = auVar94._20_4_;
      fVar69 = auVar94._24_4_;
      auVar96._4_4_ = fVar133 * fVar133 * fVar133 * auVar71._4_4_ * -0.5;
      auVar96._0_4_ = fVar144 * fVar144 * fVar144 * auVar71._0_4_ * -0.5;
      auVar96._8_4_ = fVar134 * fVar134 * fVar134 * auVar71._8_4_ * -0.5;
      auVar96._12_4_ = fVar135 * fVar135 * fVar135 * auVar71._12_4_ * -0.5;
      auVar96._16_4_ = fVar168 * fVar168 * fVar168 * -0.0;
      auVar96._20_4_ = fVar172 * fVar172 * fVar172 * -0.0;
      auVar96._24_4_ = fVar69 * fVar69 * fVar69 * -0.0;
      auVar96._28_4_ = 0;
      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar83,auVar94);
      auVar100._4_4_ = auVar93._4_4_ * auVar96._4_4_;
      auVar100._0_4_ = auVar93._0_4_ * auVar96._0_4_;
      auVar100._8_4_ = auVar93._8_4_ * auVar96._8_4_;
      auVar100._12_4_ = auVar93._12_4_ * auVar96._12_4_;
      auVar100._16_4_ = auVar93._16_4_ * auVar96._16_4_;
      auVar100._20_4_ = auVar93._20_4_ * auVar96._20_4_;
      auVar100._24_4_ = auVar93._24_4_ * auVar96._24_4_;
      auVar100._28_4_ = auVar94._28_4_;
      auVar98._4_4_ = auVar96._4_4_ * -auVar92._4_4_;
      auVar98._0_4_ = auVar96._0_4_ * -auVar92._0_4_;
      auVar98._8_4_ = auVar96._8_4_ * -auVar92._8_4_;
      auVar98._12_4_ = auVar96._12_4_ * -auVar92._12_4_;
      auVar98._16_4_ = auVar96._16_4_ * -auVar92._16_4_;
      auVar98._20_4_ = auVar96._20_4_ * -auVar92._20_4_;
      auVar98._24_4_ = auVar96._24_4_ * -auVar92._24_4_;
      auVar98._28_4_ = auVar92._28_4_ ^ 0x80000000;
      auVar94 = vmulps_avx512vl(auVar96,ZEXT1632(auVar81));
      auVar89 = ZEXT1632(auVar81);
      auVar97 = vfmadd213ps_avx512vl(auVar101,auVar101,auVar89);
      auVar71 = vfmadd231ps_fma(auVar97,auVar88,auVar88);
      auVar99 = vrsqrt14ps_avx512vl(ZEXT1632(auVar71));
      fVar144 = auVar99._0_4_;
      fVar133 = auVar99._4_4_;
      fVar134 = auVar99._8_4_;
      fVar135 = auVar99._12_4_;
      fVar168 = auVar99._16_4_;
      fVar172 = auVar99._20_4_;
      fVar69 = auVar99._24_4_;
      auVar97._4_4_ = fVar133 * fVar133 * fVar133 * auVar71._4_4_ * -0.5;
      auVar97._0_4_ = fVar144 * fVar144 * fVar144 * auVar71._0_4_ * -0.5;
      auVar97._8_4_ = fVar134 * fVar134 * fVar134 * auVar71._8_4_ * -0.5;
      auVar97._12_4_ = fVar135 * fVar135 * fVar135 * auVar71._12_4_ * -0.5;
      auVar97._16_4_ = fVar168 * fVar168 * fVar168 * -0.0;
      auVar97._20_4_ = fVar172 * fVar172 * fVar172 * -0.0;
      auVar97._24_4_ = fVar69 * fVar69 * fVar69 * -0.0;
      auVar97._28_4_ = 0;
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar83,auVar99);
      auVar83._4_4_ = auVar88._4_4_ * auVar97._4_4_;
      auVar83._0_4_ = auVar88._0_4_ * auVar97._0_4_;
      auVar83._8_4_ = auVar88._8_4_ * auVar97._8_4_;
      auVar83._12_4_ = auVar88._12_4_ * auVar97._12_4_;
      auVar83._16_4_ = auVar88._16_4_ * auVar97._16_4_;
      auVar83._20_4_ = auVar88._20_4_ * auVar97._20_4_;
      auVar83._24_4_ = auVar88._24_4_ * auVar97._24_4_;
      auVar83._28_4_ = auVar99._28_4_;
      auVar99._4_4_ = -auVar101._4_4_ * auVar97._4_4_;
      auVar99._0_4_ = -auVar101._0_4_ * auVar97._0_4_;
      auVar99._8_4_ = -auVar101._8_4_ * auVar97._8_4_;
      auVar99._12_4_ = -auVar101._12_4_ * auVar97._12_4_;
      auVar99._16_4_ = -auVar101._16_4_ * auVar97._16_4_;
      auVar99._20_4_ = -auVar101._20_4_ * auVar97._20_4_;
      auVar99._24_4_ = -auVar101._24_4_ * auVar97._24_4_;
      auVar99._28_4_ = auVar96._28_4_;
      auVar96 = vmulps_avx512vl(auVar97,auVar89);
      auVar71 = vfmadd213ps_fma(auVar100,auVar91,auVar84);
      auVar23 = vfmadd213ps_fma(auVar98,auVar91,auVar85);
      auVar97 = vfmadd213ps_avx512vl(auVar94,auVar91,auVar95);
      auVar88 = vfmadd213ps_avx512vl(auVar83,ZEXT1632(auVar73),auVar86);
      auVar80 = vfnmadd213ps_fma(auVar100,auVar91,auVar84);
      auVar84 = ZEXT1632(auVar73);
      auVar79 = vfmadd213ps_fma(auVar99,auVar84,auVar87);
      auVar129 = vfnmadd213ps_fma(auVar98,auVar91,auVar85);
      auVar74 = vfmadd213ps_fma(auVar96,auVar84,auVar82);
      auVar100 = vfnmadd231ps_avx512vl(auVar95,auVar91,auVar94);
      auVar130 = vfnmadd213ps_fma(auVar83,auVar84,auVar86);
      auVar137 = vfnmadd213ps_fma(auVar99,auVar84,auVar87);
      auVar138 = vfnmadd231ps_fma(auVar82,ZEXT1632(auVar73),auVar96);
      auVar96 = vsubps_avx512vl(auVar88,ZEXT1632(auVar80));
      auVar94 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar129));
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar74),auVar100);
      auVar82 = vmulps_avx512vl(auVar94,auVar100);
      auVar76 = vfmsub231ps_fma(auVar82,ZEXT1632(auVar129),auVar98);
      auVar95._4_4_ = auVar80._4_4_ * auVar98._4_4_;
      auVar95._0_4_ = auVar80._0_4_ * auVar98._0_4_;
      auVar95._8_4_ = auVar80._8_4_ * auVar98._8_4_;
      auVar95._12_4_ = auVar80._12_4_ * auVar98._12_4_;
      auVar95._16_4_ = auVar98._16_4_ * 0.0;
      auVar95._20_4_ = auVar98._20_4_ * 0.0;
      auVar95._24_4_ = auVar98._24_4_ * 0.0;
      auVar95._28_4_ = auVar98._28_4_;
      auVar98 = vfmsub231ps_avx512vl(auVar95,auVar100,auVar96);
      auVar84._4_4_ = auVar129._4_4_ * auVar96._4_4_;
      auVar84._0_4_ = auVar129._0_4_ * auVar96._0_4_;
      auVar84._8_4_ = auVar129._8_4_ * auVar96._8_4_;
      auVar84._12_4_ = auVar129._12_4_ * auVar96._12_4_;
      auVar84._16_4_ = auVar96._16_4_ * 0.0;
      auVar84._20_4_ = auVar96._20_4_ * 0.0;
      auVar84._24_4_ = auVar96._24_4_ * 0.0;
      auVar84._28_4_ = auVar96._28_4_;
      auVar75 = vfmsub231ps_fma(auVar84,ZEXT1632(auVar80),auVar94);
      auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),auVar89,auVar98);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,ZEXT1632(auVar76));
      auVar90 = ZEXT1632(auVar81);
      uVar63 = vcmpps_avx512vl(auVar94,auVar90,2);
      bVar60 = (byte)uVar63;
      fVar69 = (float)((uint)(bVar60 & 1) * auVar71._0_4_ |
                      (uint)!(bool)(bVar60 & 1) * auVar130._0_4_);
      bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
      fVar119 = (float)((uint)bVar64 * auVar71._4_4_ | (uint)!bVar64 * auVar130._4_4_);
      bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
      fVar121 = (float)((uint)bVar64 * auVar71._8_4_ | (uint)!bVar64 * auVar130._8_4_);
      bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
      fVar124 = (float)((uint)bVar64 * auVar71._12_4_ | (uint)!bVar64 * auVar130._12_4_);
      auVar83 = ZEXT1632(CONCAT412(fVar124,CONCAT48(fVar121,CONCAT44(fVar119,fVar69))));
      fVar70 = (float)((uint)(bVar60 & 1) * auVar23._0_4_ |
                      (uint)!(bool)(bVar60 & 1) * auVar137._0_4_);
      bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
      fVar120 = (float)((uint)bVar64 * auVar23._4_4_ | (uint)!bVar64 * auVar137._4_4_);
      bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
      fVar122 = (float)((uint)bVar64 * auVar23._8_4_ | (uint)!bVar64 * auVar137._8_4_);
      bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
      fVar125 = (float)((uint)bVar64 * auVar23._12_4_ | (uint)!bVar64 * auVar137._12_4_);
      auVar99 = ZEXT1632(CONCAT412(fVar125,CONCAT48(fVar122,CONCAT44(fVar120,fVar70))));
      auVar89._0_4_ =
           (float)((uint)(bVar60 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar138._0_4_);
      bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar89._4_4_ = (float)((uint)bVar64 * auVar97._4_4_ | (uint)!bVar64 * auVar138._4_4_);
      bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar89._8_4_ = (float)((uint)bVar64 * auVar97._8_4_ | (uint)!bVar64 * auVar138._8_4_);
      bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar89._12_4_ = (float)((uint)bVar64 * auVar97._12_4_ | (uint)!bVar64 * auVar138._12_4_);
      fVar144 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar97._16_4_);
      auVar89._16_4_ = fVar144;
      fVar133 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar97._20_4_);
      auVar89._20_4_ = fVar133;
      fVar134 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar97._24_4_);
      auVar89._24_4_ = fVar134;
      iVar1 = (uint)(byte)(uVar63 >> 7) * auVar97._28_4_;
      auVar89._28_4_ = iVar1;
      auVar96 = vblendmps_avx512vl(ZEXT1632(auVar80),auVar88);
      auVar102._0_4_ =
           (uint)(bVar60 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar23._0_4_;
      bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar102._4_4_ = (uint)bVar64 * auVar96._4_4_ | (uint)!bVar64 * auVar23._4_4_;
      bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar102._8_4_ = (uint)bVar64 * auVar96._8_4_ | (uint)!bVar64 * auVar23._8_4_;
      bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar102._12_4_ = (uint)bVar64 * auVar96._12_4_ | (uint)!bVar64 * auVar23._12_4_;
      auVar102._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * auVar96._16_4_;
      auVar102._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * auVar96._20_4_;
      auVar102._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * auVar96._24_4_;
      auVar102._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar96._28_4_;
      auVar96 = vblendmps_avx512vl(ZEXT1632(auVar129),ZEXT1632(auVar79));
      auVar103._0_4_ =
           (float)((uint)(bVar60 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar76._0_4_);
      bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar103._4_4_ = (float)((uint)bVar64 * auVar96._4_4_ | (uint)!bVar64 * auVar76._4_4_);
      bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar103._8_4_ = (float)((uint)bVar64 * auVar96._8_4_ | (uint)!bVar64 * auVar76._8_4_);
      bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar103._12_4_ = (float)((uint)bVar64 * auVar96._12_4_ | (uint)!bVar64 * auVar76._12_4_);
      fVar135 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar96._16_4_);
      auVar103._16_4_ = fVar135;
      fVar168 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar96._20_4_);
      auVar103._20_4_ = fVar168;
      fVar172 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar96._24_4_);
      auVar103._24_4_ = fVar172;
      auVar103._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar96._28_4_;
      auVar96 = vblendmps_avx512vl(auVar100,ZEXT1632(auVar74));
      auVar104._0_4_ =
           (float)((uint)(bVar60 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar97._0_4_);
      bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar104._4_4_ = (float)((uint)bVar64 * auVar96._4_4_ | (uint)!bVar64 * auVar97._4_4_);
      bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar104._8_4_ = (float)((uint)bVar64 * auVar96._8_4_ | (uint)!bVar64 * auVar97._8_4_);
      bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar104._12_4_ = (float)((uint)bVar64 * auVar96._12_4_ | (uint)!bVar64 * auVar97._12_4_);
      bVar64 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar104._16_4_ = (float)((uint)bVar64 * auVar96._16_4_ | (uint)!bVar64 * auVar97._16_4_);
      bVar64 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar104._20_4_ = (float)((uint)bVar64 * auVar96._20_4_ | (uint)!bVar64 * auVar97._20_4_);
      bVar64 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar104._24_4_ = (float)((uint)bVar64 * auVar96._24_4_ | (uint)!bVar64 * auVar97._24_4_);
      bVar64 = SUB81(uVar63 >> 7,0);
      auVar104._28_4_ = (uint)bVar64 * auVar96._28_4_ | (uint)!bVar64 * auVar97._28_4_;
      auVar105._0_4_ =
           (uint)(bVar60 & 1) * (int)auVar80._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar88._0_4_;
      bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar105._4_4_ = (uint)bVar64 * (int)auVar80._4_4_ | (uint)!bVar64 * auVar88._4_4_;
      bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar105._8_4_ = (uint)bVar64 * (int)auVar80._8_4_ | (uint)!bVar64 * auVar88._8_4_;
      bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar105._12_4_ = (uint)bVar64 * (int)auVar80._12_4_ | (uint)!bVar64 * auVar88._12_4_;
      auVar105._16_4_ = (uint)!(bool)((byte)(uVar63 >> 4) & 1) * auVar88._16_4_;
      auVar105._20_4_ = (uint)!(bool)((byte)(uVar63 >> 5) & 1) * auVar88._20_4_;
      auVar105._24_4_ = (uint)!(bool)((byte)(uVar63 >> 6) & 1) * auVar88._24_4_;
      auVar105._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar88._28_4_;
      bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
      bVar13 = (bool)((byte)(uVar63 >> 2) & 1);
      bVar15 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar106._0_4_ =
           (uint)(bVar60 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar74._0_4_;
      bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar106._4_4_ = (uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar74._4_4_;
      bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar106._8_4_ = (uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar74._8_4_;
      bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar106._12_4_ = (uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar74._12_4_;
      auVar106._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * auVar100._16_4_;
      auVar106._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * auVar100._20_4_;
      auVar106._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * auVar100._24_4_;
      iVar2 = (uint)(byte)(uVar63 >> 7) * auVar100._28_4_;
      auVar106._28_4_ = iVar2;
      auVar95 = vsubps_avx512vl(auVar105,auVar83);
      auVar96 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar129._12_4_ |
                                              (uint)!bVar15 * auVar79._12_4_,
                                              CONCAT48((uint)bVar13 * (int)auVar129._8_4_ |
                                                       (uint)!bVar13 * auVar79._8_4_,
                                                       CONCAT44((uint)bVar64 * (int)auVar129._4_4_ |
                                                                (uint)!bVar64 * auVar79._4_4_,
                                                                (uint)(bVar60 & 1) *
                                                                (int)auVar129._0_4_ |
                                                                (uint)!(bool)(bVar60 & 1) *
                                                                auVar79._0_4_)))),auVar99);
      auVar100 = vsubps_avx(auVar106,auVar89);
      auVar98 = vsubps_avx(auVar83,auVar102);
      auVar97 = vsubps_avx(auVar99,auVar103);
      auVar82 = vsubps_avx(auVar89,auVar104);
      auVar85._4_4_ = auVar100._4_4_ * fVar119;
      auVar85._0_4_ = auVar100._0_4_ * fVar69;
      auVar85._8_4_ = auVar100._8_4_ * fVar121;
      auVar85._12_4_ = auVar100._12_4_ * fVar124;
      auVar85._16_4_ = auVar100._16_4_ * 0.0;
      auVar85._20_4_ = auVar100._20_4_ * 0.0;
      auVar85._24_4_ = auVar100._24_4_ * 0.0;
      auVar85._28_4_ = iVar2;
      auVar71 = vfmsub231ps_fma(auVar85,auVar89,auVar95);
      auVar86._4_4_ = fVar120 * auVar95._4_4_;
      auVar86._0_4_ = fVar70 * auVar95._0_4_;
      auVar86._8_4_ = fVar122 * auVar95._8_4_;
      auVar86._12_4_ = fVar125 * auVar95._12_4_;
      auVar86._16_4_ = auVar95._16_4_ * 0.0;
      auVar86._20_4_ = auVar95._20_4_ * 0.0;
      auVar86._24_4_ = auVar95._24_4_ * 0.0;
      auVar86._28_4_ = auVar94._28_4_;
      auVar23 = vfmsub231ps_fma(auVar86,auVar83,auVar96);
      auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar23),auVar90,ZEXT1632(auVar71));
      auVar157._0_4_ = auVar96._0_4_ * auVar89._0_4_;
      auVar157._4_4_ = auVar96._4_4_ * auVar89._4_4_;
      auVar157._8_4_ = auVar96._8_4_ * auVar89._8_4_;
      auVar157._12_4_ = auVar96._12_4_ * auVar89._12_4_;
      auVar157._16_4_ = auVar96._16_4_ * fVar144;
      auVar157._20_4_ = auVar96._20_4_ * fVar133;
      auVar157._24_4_ = auVar96._24_4_ * fVar134;
      auVar157._28_4_ = 0;
      auVar71 = vfmsub231ps_fma(auVar157,auVar99,auVar100);
      auVar84 = vfmadd231ps_avx512vl(auVar94,auVar90,ZEXT1632(auVar71));
      auVar94 = vmulps_avx512vl(auVar82,auVar102);
      auVar94 = vfmsub231ps_avx512vl(auVar94,auVar98,auVar104);
      auVar87._4_4_ = auVar97._4_4_ * auVar104._4_4_;
      auVar87._0_4_ = auVar97._0_4_ * auVar104._0_4_;
      auVar87._8_4_ = auVar97._8_4_ * auVar104._8_4_;
      auVar87._12_4_ = auVar97._12_4_ * auVar104._12_4_;
      auVar87._16_4_ = auVar97._16_4_ * auVar104._16_4_;
      auVar87._20_4_ = auVar97._20_4_ * auVar104._20_4_;
      auVar87._24_4_ = auVar97._24_4_ * auVar104._24_4_;
      auVar87._28_4_ = auVar104._28_4_;
      auVar71 = vfmsub231ps_fma(auVar87,auVar103,auVar82);
      auVar158._0_4_ = auVar103._0_4_ * auVar98._0_4_;
      auVar158._4_4_ = auVar103._4_4_ * auVar98._4_4_;
      auVar158._8_4_ = auVar103._8_4_ * auVar98._8_4_;
      auVar158._12_4_ = auVar103._12_4_ * auVar98._12_4_;
      auVar158._16_4_ = fVar135 * auVar98._16_4_;
      auVar158._20_4_ = fVar168 * auVar98._20_4_;
      auVar158._24_4_ = fVar172 * auVar98._24_4_;
      auVar158._28_4_ = 0;
      auVar23 = vfmsub231ps_fma(auVar158,auVar97,auVar102);
      auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar23),auVar90,auVar94);
      auVar85 = vfmadd231ps_avx512vl(auVar94,auVar90,ZEXT1632(auVar71));
      auVar94 = vmaxps_avx(auVar84,auVar85);
      uVar136 = vcmpps_avx512vl(auVar94,auVar90,2);
      bVar68 = bVar68 & (byte)uVar136;
      auVar190 = ZEXT3264(local_4c0);
      auVar191 = ZEXT3264(local_4a0);
      auVar187 = ZEXT3264(local_600);
      auVar186 = ZEXT3264(local_5e0);
      if (bVar68 == 0) {
        bVar64 = false;
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar188 = ZEXT3264(auVar94);
        auVar192 = ZEXT3264(local_580);
        auVar193 = ZEXT3264(local_5a0);
        auVar195 = ZEXT3264(local_5c0);
      }
      else {
        auVar33._4_4_ = auVar82._4_4_ * auVar96._4_4_;
        auVar33._0_4_ = auVar82._0_4_ * auVar96._0_4_;
        auVar33._8_4_ = auVar82._8_4_ * auVar96._8_4_;
        auVar33._12_4_ = auVar82._12_4_ * auVar96._12_4_;
        auVar33._16_4_ = auVar82._16_4_ * auVar96._16_4_;
        auVar33._20_4_ = auVar82._20_4_ * auVar96._20_4_;
        auVar33._24_4_ = auVar82._24_4_ * auVar96._24_4_;
        auVar33._28_4_ = auVar94._28_4_;
        auVar79 = vfmsub231ps_fma(auVar33,auVar97,auVar100);
        auVar34._4_4_ = auVar100._4_4_ * auVar98._4_4_;
        auVar34._0_4_ = auVar100._0_4_ * auVar98._0_4_;
        auVar34._8_4_ = auVar100._8_4_ * auVar98._8_4_;
        auVar34._12_4_ = auVar100._12_4_ * auVar98._12_4_;
        auVar34._16_4_ = auVar100._16_4_ * auVar98._16_4_;
        auVar34._20_4_ = auVar100._20_4_ * auVar98._20_4_;
        auVar34._24_4_ = auVar100._24_4_ * auVar98._24_4_;
        auVar34._28_4_ = auVar100._28_4_;
        auVar23 = vfmsub231ps_fma(auVar34,auVar95,auVar82);
        auVar35._4_4_ = auVar97._4_4_ * auVar95._4_4_;
        auVar35._0_4_ = auVar97._0_4_ * auVar95._0_4_;
        auVar35._8_4_ = auVar97._8_4_ * auVar95._8_4_;
        auVar35._12_4_ = auVar97._12_4_ * auVar95._12_4_;
        auVar35._16_4_ = auVar97._16_4_ * auVar95._16_4_;
        auVar35._20_4_ = auVar97._20_4_ * auVar95._20_4_;
        auVar35._24_4_ = auVar97._24_4_ * auVar95._24_4_;
        auVar35._28_4_ = auVar97._28_4_;
        auVar74 = vfmsub231ps_fma(auVar35,auVar98,auVar96);
        auVar71 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar23),ZEXT1632(auVar74));
        auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar71),ZEXT1632(auVar79),auVar90);
        auVar96 = vrcp14ps_avx512vl(auVar94);
        auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar188 = ZEXT3264(auVar100);
        auVar98 = vfnmadd213ps_avx512vl(auVar96,auVar94,auVar100);
        auVar71 = vfmadd132ps_fma(auVar98,auVar96,auVar96);
        auVar36._4_4_ = auVar74._4_4_ * auVar89._4_4_;
        auVar36._0_4_ = auVar74._0_4_ * auVar89._0_4_;
        auVar36._8_4_ = auVar74._8_4_ * auVar89._8_4_;
        auVar36._12_4_ = auVar74._12_4_ * auVar89._12_4_;
        auVar36._16_4_ = fVar144 * 0.0;
        auVar36._20_4_ = fVar133 * 0.0;
        auVar36._24_4_ = fVar134 * 0.0;
        auVar36._28_4_ = iVar1;
        auVar23 = vfmadd231ps_fma(auVar36,auVar99,ZEXT1632(auVar23));
        auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar83,ZEXT1632(auVar79));
        fVar144 = auVar71._0_4_;
        fVar133 = auVar71._4_4_;
        fVar134 = auVar71._8_4_;
        fVar135 = auVar71._12_4_;
        local_380 = ZEXT1632(CONCAT412(auVar23._12_4_ * fVar135,
                                       CONCAT48(auVar23._8_4_ * fVar134,
                                                CONCAT44(auVar23._4_4_ * fVar133,
                                                         auVar23._0_4_ * fVar144))));
        auVar175._4_4_ = uVar179;
        auVar175._0_4_ = uVar179;
        auVar175._8_4_ = uVar179;
        auVar175._12_4_ = uVar179;
        auVar175._16_4_ = uVar179;
        auVar175._20_4_ = uVar179;
        auVar175._24_4_ = uVar179;
        auVar175._28_4_ = uVar179;
        uVar136 = vcmpps_avx512vl(auVar175,local_380,2);
        uVar128 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar28._4_4_ = uVar128;
        auVar28._0_4_ = uVar128;
        auVar28._8_4_ = uVar128;
        auVar28._12_4_ = uVar128;
        auVar28._16_4_ = uVar128;
        auVar28._20_4_ = uVar128;
        auVar28._24_4_ = uVar128;
        auVar28._28_4_ = uVar128;
        uVar25 = vcmpps_avx512vl(local_380,auVar28,2);
        bVar68 = (byte)uVar136 & (byte)uVar25 & bVar68;
        auVar192 = ZEXT3264(local_580);
        auVar193 = ZEXT3264(local_5a0);
        auVar195 = ZEXT3264(local_5c0);
        if (bVar68 != 0) {
          uVar136 = vcmpps_avx512vl(auVar94,auVar90,4);
          bVar68 = bVar68 & (byte)uVar136;
          if (bVar68 != 0) {
            fVar168 = auVar84._0_4_ * fVar144;
            fVar172 = auVar84._4_4_ * fVar133;
            auVar37._4_4_ = fVar172;
            auVar37._0_4_ = fVar168;
            fVar69 = auVar84._8_4_ * fVar134;
            auVar37._8_4_ = fVar69;
            fVar70 = auVar84._12_4_ * fVar135;
            auVar37._12_4_ = fVar70;
            fVar119 = auVar84._16_4_ * 0.0;
            auVar37._16_4_ = fVar119;
            fVar120 = auVar84._20_4_ * 0.0;
            auVar37._20_4_ = fVar120;
            fVar121 = auVar84._24_4_ * 0.0;
            auVar37._24_4_ = fVar121;
            auVar37._28_4_ = auVar94._28_4_;
            auVar96 = vsubps_avx512vl(auVar100,auVar37);
            local_3c0._0_4_ =
                 (float)((uint)(bVar60 & 1) * (int)fVar168 |
                        (uint)!(bool)(bVar60 & 1) * auVar96._0_4_);
            bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
            local_3c0._4_4_ = (float)((uint)bVar64 * (int)fVar172 | (uint)!bVar64 * auVar96._4_4_);
            bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
            local_3c0._8_4_ = (float)((uint)bVar64 * (int)fVar69 | (uint)!bVar64 * auVar96._8_4_);
            bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
            local_3c0._12_4_ = (float)((uint)bVar64 * (int)fVar70 | (uint)!bVar64 * auVar96._12_4_);
            bVar64 = (bool)((byte)(uVar63 >> 4) & 1);
            local_3c0._16_4_ = (float)((uint)bVar64 * (int)fVar119 | (uint)!bVar64 * auVar96._16_4_)
            ;
            bVar64 = (bool)((byte)(uVar63 >> 5) & 1);
            local_3c0._20_4_ = (float)((uint)bVar64 * (int)fVar120 | (uint)!bVar64 * auVar96._20_4_)
            ;
            bVar64 = (bool)((byte)(uVar63 >> 6) & 1);
            local_3c0._24_4_ = (float)((uint)bVar64 * (int)fVar121 | (uint)!bVar64 * auVar96._24_4_)
            ;
            bVar64 = SUB81(uVar63 >> 7,0);
            local_3c0._28_4_ =
                 (float)((uint)bVar64 * auVar94._28_4_ | (uint)!bVar64 * auVar96._28_4_);
            auVar94 = vsubps_avx(ZEXT1632(auVar73),auVar91);
            auVar71 = vfmadd213ps_fma(auVar94,local_3c0,auVar91);
            uVar128 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
            auVar91._4_4_ = uVar128;
            auVar91._0_4_ = uVar128;
            auVar91._8_4_ = uVar128;
            auVar91._12_4_ = uVar128;
            auVar91._16_4_ = uVar128;
            auVar91._20_4_ = uVar128;
            auVar91._24_4_ = uVar128;
            auVar91._28_4_ = uVar128;
            auVar94 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar71._12_4_ + auVar71._12_4_,
                                                         CONCAT48(auVar71._8_4_ + auVar71._8_4_,
                                                                  CONCAT44(auVar71._4_4_ +
                                                                           auVar71._4_4_,
                                                                           auVar71._0_4_ +
                                                                           auVar71._0_4_)))),auVar91
                                     );
            uVar136 = vcmpps_avx512vl(local_380,auVar94,6);
            if (((byte)uVar136 & bVar68) != 0) {
              auVar143._0_4_ = auVar85._0_4_ * fVar144;
              auVar143._4_4_ = auVar85._4_4_ * fVar133;
              auVar143._8_4_ = auVar85._8_4_ * fVar134;
              auVar143._12_4_ = auVar85._12_4_ * fVar135;
              auVar143._16_4_ = auVar85._16_4_ * 0.0;
              auVar143._20_4_ = auVar85._20_4_ * 0.0;
              auVar143._24_4_ = auVar85._24_4_ * 0.0;
              auVar143._28_4_ = 0;
              auVar94 = vsubps_avx512vl(auVar100,auVar143);
              auVar107._0_4_ =
                   (uint)(bVar60 & 1) * (int)auVar143._0_4_ |
                   (uint)!(bool)(bVar60 & 1) * auVar94._0_4_;
              bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
              auVar107._4_4_ = (uint)bVar64 * (int)auVar143._4_4_ | (uint)!bVar64 * auVar94._4_4_;
              bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
              auVar107._8_4_ = (uint)bVar64 * (int)auVar143._8_4_ | (uint)!bVar64 * auVar94._8_4_;
              bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
              auVar107._12_4_ = (uint)bVar64 * (int)auVar143._12_4_ | (uint)!bVar64 * auVar94._12_4_
              ;
              bVar64 = (bool)((byte)(uVar63 >> 4) & 1);
              auVar107._16_4_ = (uint)bVar64 * (int)auVar143._16_4_ | (uint)!bVar64 * auVar94._16_4_
              ;
              bVar64 = (bool)((byte)(uVar63 >> 5) & 1);
              auVar107._20_4_ = (uint)bVar64 * (int)auVar143._20_4_ | (uint)!bVar64 * auVar94._20_4_
              ;
              bVar64 = (bool)((byte)(uVar63 >> 6) & 1);
              auVar107._24_4_ = (uint)bVar64 * (int)auVar143._24_4_ | (uint)!bVar64 * auVar94._24_4_
              ;
              auVar107._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar94._28_4_;
              auVar29._8_4_ = 0x40000000;
              auVar29._0_8_ = 0x4000000040000000;
              auVar29._12_4_ = 0x40000000;
              auVar29._16_4_ = 0x40000000;
              auVar29._20_4_ = 0x40000000;
              auVar29._24_4_ = 0x40000000;
              auVar29._28_4_ = 0x40000000;
              local_3a0 = vfmsub132ps_avx512vl(auVar107,auVar100,auVar29);
              local_360 = 0;
              if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar64 = true, pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_018086c4;
                fVar144 = 1.0 / (float)local_420._0_4_;
                local_300[0] = fVar144 * (local_3c0._0_4_ + 0.0);
                local_300[1] = fVar144 * (local_3c0._4_4_ + 1.0);
                local_300[2] = fVar144 * (local_3c0._8_4_ + 2.0);
                local_300[3] = fVar144 * (local_3c0._12_4_ + 3.0);
                fStack_2f0 = fVar144 * (local_3c0._16_4_ + 4.0);
                fStack_2ec = fVar144 * (local_3c0._20_4_ + 5.0);
                fStack_2e8 = fVar144 * (local_3c0._24_4_ + 6.0);
                fStack_2e4 = local_3c0._28_4_ + 7.0;
                local_2e0 = local_3a0;
                local_2c0 = local_380;
                lVar61 = 0;
                local_440 = (ulong)((byte)uVar136 & bVar68);
                for (uVar63 = local_440; (uVar63 & 1) == 0;
                    uVar63 = uVar63 >> 1 | 0x8000000000000000) {
                  lVar61 = lVar61 + 1;
                }
                local_460 = vpbroadcastd_avx512vl();
                local_35c = iVar9;
                local_350 = auVar78;
                local_340 = uVar24;
                uStack_338 = uVar26;
                local_330 = uVar56;
                uStack_328 = uVar57;
                while( true ) {
                  auVar77 = auVar196._0_16_;
                  auVar71 = auVar189._0_16_;
                  if (local_440 == 0) break;
                  uVar128 = *(undefined4 *)(ray + k * 4 + 0x100);
                  fVar144 = local_300[lVar61];
                  auVar139._4_4_ = fVar144;
                  auVar139._0_4_ = fVar144;
                  auVar139._8_4_ = fVar144;
                  auVar139._12_4_ = fVar144;
                  local_200._16_4_ = fVar144;
                  local_200._0_16_ = auVar139;
                  local_200._20_4_ = fVar144;
                  local_200._24_4_ = fVar144;
                  local_200._28_4_ = fVar144;
                  local_400 = (uint)lVar61;
                  uStack_3fc = (uint)((ulong)lVar61 >> 0x20);
                  local_1e0 = *(undefined4 *)(local_2e0 + lVar61 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + lVar61 * 4);
                  local_630.context = context->user;
                  fVar133 = 1.0 - fVar144;
                  auVar79 = vfnmadd231ss_fma(ZEXT416((uint)(fVar144 * (fVar133 + fVar133))),
                                             ZEXT416((uint)fVar133),ZEXT416((uint)fVar133));
                  auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar139,
                                            ZEXT416(0xc0a00000));
                  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar144 * fVar144 * 3.0)),
                                            ZEXT416((uint)(fVar144 + fVar144)),auVar77);
                  auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar139,
                                            ZEXT416(0x40000000));
                  auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * fVar133 * -3.0)),
                                            ZEXT416((uint)(fVar133 + fVar133)),auVar77);
                  auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar144 * fVar144)),auVar139,
                                            ZEXT416((uint)(fVar133 * -2.0)));
                  fVar144 = auVar79._0_4_ * 0.5;
                  fVar133 = auVar23._0_4_ * 0.5;
                  fVar134 = auVar77._0_4_ * 0.5;
                  fVar135 = auVar73._0_4_ * 0.5;
                  auVar150._0_4_ = fVar135 * local_520;
                  auVar150._4_4_ = fVar135 * fStack_51c;
                  auVar150._8_4_ = fVar135 * fStack_518;
                  auVar150._12_4_ = fVar135 * fStack_514;
                  auVar164._4_4_ = fVar134;
                  auVar164._0_4_ = fVar134;
                  auVar164._8_4_ = fVar134;
                  auVar164._12_4_ = fVar134;
                  auVar77 = vfmadd132ps_fma(auVar164,auVar150,auVar20);
                  auVar151._4_4_ = fVar133;
                  auVar151._0_4_ = fVar133;
                  auVar151._8_4_ = fVar133;
                  auVar151._12_4_ = fVar133;
                  auVar77 = vfmadd132ps_fma(auVar151,auVar77,auVar21);
                  auVar131._4_4_ = fVar144;
                  auVar131._0_4_ = fVar144;
                  auVar131._8_4_ = fVar144;
                  auVar131._12_4_ = fVar144;
                  auVar77 = vfmadd213ps_fma(auVar131,auVar78,auVar77);
                  local_260 = auVar77._0_4_;
                  auVar159._8_4_ = 1;
                  auVar159._0_8_ = 0x100000001;
                  auVar159._12_4_ = 1;
                  auVar159._16_4_ = 1;
                  auVar159._20_4_ = 1;
                  auVar159._24_4_ = 1;
                  auVar159._28_4_ = 1;
                  local_240 = vpermps_avx2(auVar159,ZEXT1632(auVar77));
                  auVar166._8_4_ = 2;
                  auVar166._0_8_ = 0x200000002;
                  auVar166._12_4_ = 2;
                  auVar166._16_4_ = 2;
                  auVar166._20_4_ = 2;
                  auVar166._24_4_ = 2;
                  auVar166._28_4_ = 2;
                  local_220 = vpermps_avx2(auVar166,ZEXT1632(auVar77));
                  uStack_25c = local_260;
                  uStack_258 = local_260;
                  uStack_254 = local_260;
                  uStack_250 = local_260;
                  uStack_24c = local_260;
                  uStack_248 = local_260;
                  uStack_244 = local_260;
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_1c0 = local_280._0_8_;
                  uStack_1b8 = local_280._8_8_;
                  uStack_1b0 = local_280._16_8_;
                  uStack_1a8 = local_280._24_8_;
                  local_1a0 = local_460;
                  vpcmpeqd_avx2(local_460,local_460);
                  local_180 = (local_630.context)->instID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_160 = (local_630.context)->instPrimID[0];
                  uStack_15c = local_160;
                  uStack_158 = local_160;
                  uStack_154 = local_160;
                  uStack_150 = local_160;
                  uStack_14c = local_160;
                  uStack_148 = local_160;
                  uStack_144 = local_160;
                  local_540 = local_2a0;
                  local_630.valid = (int *)local_540;
                  local_630.geometryUserPtr = pGVar10->userPtr;
                  local_630.hit = (RTCHitN *)&local_260;
                  local_630.N = 8;
                  local_630.ray = (RTCRayN *)ray;
                  if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar10->occlusionFilterN)(&local_630);
                    auVar196 = ZEXT1664(local_480._0_16_);
                    auVar195 = ZEXT3264(local_5c0);
                    auVar193 = ZEXT3264(local_5a0);
                    auVar194 = ZEXT3264(local_4e0);
                    auVar192 = ZEXT3264(local_580);
                    auVar186 = ZEXT3264(local_5e0);
                    auVar187 = ZEXT3264(local_600);
                    auVar191 = ZEXT3264(local_4a0);
                    auVar190 = ZEXT3264(local_4c0);
                    auVar77 = vxorps_avx512vl(auVar71,auVar71);
                    auVar189 = ZEXT1664(auVar77);
                    auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar188 = ZEXT3264(auVar94);
                    uVar179 = local_500._0_4_;
                  }
                  auVar77 = auVar189._0_16_;
                  if (local_540 != (undefined1  [32])0x0) {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&local_630);
                      auVar196 = ZEXT1664(local_480._0_16_);
                      auVar195 = ZEXT3264(local_5c0);
                      auVar193 = ZEXT3264(local_5a0);
                      auVar194 = ZEXT3264(local_4e0);
                      auVar192 = ZEXT3264(local_580);
                      auVar186 = ZEXT3264(local_5e0);
                      auVar187 = ZEXT3264(local_600);
                      auVar191 = ZEXT3264(local_4a0);
                      auVar190 = ZEXT3264(local_4c0);
                      auVar77 = vxorps_avx512vl(auVar77,auVar77);
                      auVar189 = ZEXT1664(auVar77);
                      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar188 = ZEXT3264(auVar94);
                      uVar179 = local_500._0_4_;
                    }
                    auVar77 = auVar196._0_16_;
                    uVar63 = vptestmd_avx512vl(local_540,local_540);
                    auVar94 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar64 = (bool)((byte)uVar63 & 1);
                    auVar108._0_4_ =
                         (uint)bVar64 * auVar94._0_4_ |
                         (uint)!bVar64 * *(int *)(local_630.ray + 0x100);
                    bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
                    auVar108._4_4_ =
                         (uint)bVar64 * auVar94._4_4_ |
                         (uint)!bVar64 * *(int *)(local_630.ray + 0x104);
                    bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
                    auVar108._8_4_ =
                         (uint)bVar64 * auVar94._8_4_ |
                         (uint)!bVar64 * *(int *)(local_630.ray + 0x108);
                    bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
                    auVar108._12_4_ =
                         (uint)bVar64 * auVar94._12_4_ |
                         (uint)!bVar64 * *(int *)(local_630.ray + 0x10c);
                    bVar64 = (bool)((byte)(uVar63 >> 4) & 1);
                    auVar108._16_4_ =
                         (uint)bVar64 * auVar94._16_4_ |
                         (uint)!bVar64 * *(int *)(local_630.ray + 0x110);
                    bVar64 = (bool)((byte)(uVar63 >> 5) & 1);
                    auVar108._20_4_ =
                         (uint)bVar64 * auVar94._20_4_ |
                         (uint)!bVar64 * *(int *)(local_630.ray + 0x114);
                    bVar64 = (bool)((byte)(uVar63 >> 6) & 1);
                    auVar108._24_4_ =
                         (uint)bVar64 * auVar94._24_4_ |
                         (uint)!bVar64 * *(int *)(local_630.ray + 0x118);
                    bVar64 = SUB81(uVar63 >> 7,0);
                    auVar108._28_4_ =
                         (uint)bVar64 * auVar94._28_4_ |
                         (uint)!bVar64 * *(int *)(local_630.ray + 0x11c);
                    *(undefined1 (*) [32])(local_630.ray + 0x100) = auVar108;
                    if (local_540 != (undefined1  [32])0x0) {
                      bVar64 = true;
                      goto LAB_018086c4;
                    }
                  }
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar128;
                  lVar61 = 0;
                  local_440 = local_440 ^ 1L << ((ulong)local_400 & 0x3f);
                  for (uVar63 = local_440; (uVar63 & 1) == 0;
                      uVar63 = uVar63 >> 1 | 0x8000000000000000) {
                    lVar61 = lVar61 + 1;
                  }
                }
              }
            }
          }
        }
        bVar64 = false;
      }
    }
LAB_018086c4:
    if (8 < iVar9) {
      local_480 = vpbroadcastd_avx512vl();
      local_500 = vbroadcastss_avx512vl(auVar77);
      fStack_438 = 1.0 / (float)local_420._0_4_;
      local_420 = vpbroadcastd_avx512vl();
      local_5e0 = auVar186._0_32_;
      fStack_434 = fStack_438;
      fStack_430 = fStack_438;
      fStack_42c = fStack_438;
      fStack_428 = fStack_438;
      fStack_424 = fStack_438;
      local_400 = uVar179;
      uStack_3fc = uVar179;
      uStack_3f8 = uVar179;
      uStack_3f4 = uVar179;
      uStack_3f0 = uVar179;
      uStack_3ec = uVar179;
      uStack_3e8 = uVar179;
      uStack_3e4 = uVar179;
      local_440._0_4_ = fStack_438;
      local_440._4_4_ = fStack_438;
      for (lVar61 = 8; lVar61 < iVar9; lVar61 = lVar61 + 8) {
        auVar94 = vpbroadcastd_avx512vl();
        auVar97 = vpor_avx2(auVar94,_DAT_01fb4ba0);
        uVar25 = vpcmpd_avx512vl(auVar97,local_480,1);
        auVar94 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar61 * 4 + lVar66);
        auVar96 = *(undefined1 (*) [32])(lVar66 + 0x22047f0 + lVar61 * 4);
        auVar100 = *(undefined1 (*) [32])(lVar66 + 0x2204c74 + lVar61 * 4);
        auVar98 = *(undefined1 (*) [32])(lVar66 + 0x22050f8 + lVar61 * 4);
        local_5a0 = auVar193._0_32_;
        auVar82 = vmulps_avx512vl(local_5a0,auVar98);
        local_5c0 = auVar195._0_32_;
        auVar83 = vmulps_avx512vl(local_5c0,auVar98);
        auVar38._4_4_ = auVar98._4_4_ * (float)local_e0._4_4_;
        auVar38._0_4_ = auVar98._0_4_ * (float)local_e0._0_4_;
        auVar38._8_4_ = auVar98._8_4_ * fStack_d8;
        auVar38._12_4_ = auVar98._12_4_ * fStack_d4;
        auVar38._16_4_ = auVar98._16_4_ * fStack_d0;
        auVar38._20_4_ = auVar98._20_4_ * fStack_cc;
        auVar38._24_4_ = auVar98._24_4_ * fStack_c8;
        auVar38._28_4_ = auVar97._28_4_;
        local_580 = auVar192._0_32_;
        auVar97 = vfmadd231ps_avx512vl(auVar82,auVar100,local_580);
        auVar102 = auVar194._0_32_;
        auVar82 = vfmadd231ps_avx512vl(auVar83,auVar100,auVar102);
        auVar83 = vfmadd231ps_avx512vl(auVar38,auVar100,local_c0);
        auVar93 = auVar187._0_32_;
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar96,auVar93);
        auVar92 = auVar186._0_32_;
        auVar82 = vfmadd231ps_avx512vl(auVar82,auVar96,auVar92);
        auVar77 = vfmadd231ps_fma(auVar83,auVar96,local_a0);
        auVar101 = auVar190._0_32_;
        auVar85 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar101);
        local_4a0 = auVar191._0_32_;
        auVar86 = vfmadd231ps_avx512vl(auVar82,auVar94,local_4a0);
        auVar97 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar61 * 4 + lVar66);
        auVar82 = *(undefined1 (*) [32])(lVar66 + 0x2206c10 + lVar61 * 4);
        auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar94,local_80);
        auVar83 = *(undefined1 (*) [32])(lVar66 + 0x2207094 + lVar61 * 4);
        auVar99 = *(undefined1 (*) [32])(lVar66 + 0x2207518 + lVar61 * 4);
        auVar95 = vmulps_avx512vl(local_5a0,auVar99);
        auVar84 = vmulps_avx512vl(local_5c0,auVar99);
        auVar39._4_4_ = auVar99._4_4_ * (float)local_e0._4_4_;
        auVar39._0_4_ = auVar99._0_4_ * (float)local_e0._0_4_;
        auVar39._8_4_ = auVar99._8_4_ * fStack_d8;
        auVar39._12_4_ = auVar99._12_4_ * fStack_d4;
        auVar39._16_4_ = auVar99._16_4_ * fStack_d0;
        auVar39._20_4_ = auVar99._20_4_ * fStack_cc;
        auVar39._24_4_ = auVar99._24_4_ * fStack_c8;
        auVar39._28_4_ = uStack_c4;
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar83,local_580);
        auVar84 = vfmadd231ps_avx512vl(auVar84,auVar83,auVar102);
        auVar87 = vfmadd231ps_avx512vl(auVar39,auVar83,local_c0);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar82,auVar93);
        auVar84 = vfmadd231ps_avx512vl(auVar84,auVar82,auVar92);
        auVar71 = vfmadd231ps_fma(auVar87,auVar82,local_a0);
        auVar87 = vfmadd231ps_avx512vl(auVar95,auVar97,auVar101);
        auVar88 = vfmadd231ps_avx512vl(auVar84,auVar97,local_4a0);
        auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar97,local_80);
        auVar89 = vmaxps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar71));
        auVar95 = vsubps_avx(auVar87,auVar85);
        auVar84 = vsubps_avx(auVar88,auVar86);
        auVar90 = vmulps_avx512vl(auVar86,auVar95);
        auVar91 = vmulps_avx512vl(auVar85,auVar84);
        auVar90 = vsubps_avx512vl(auVar90,auVar91);
        auVar91 = vmulps_avx512vl(auVar84,auVar84);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar95,auVar95);
        auVar89 = vmulps_avx512vl(auVar89,auVar89);
        auVar89 = vmulps_avx512vl(auVar89,auVar91);
        auVar90 = vmulps_avx512vl(auVar90,auVar90);
        uVar136 = vcmpps_avx512vl(auVar90,auVar89,2);
        bVar68 = (byte)uVar25 & (byte)uVar136;
        if (bVar68 == 0) {
          auVar187 = ZEXT3264(auVar93);
          auVar186 = ZEXT3264(auVar92);
        }
        else {
          auVar99 = vmulps_avx512vl(local_560,auVar99);
          auVar83 = vfmadd213ps_avx512vl(auVar83,local_140,auVar99);
          auVar82 = vfmadd213ps_avx512vl(auVar82,local_120,auVar83);
          auVar97 = vfmadd213ps_avx512vl(auVar97,local_100,auVar82);
          auVar98 = vmulps_avx512vl(local_560,auVar98);
          auVar100 = vfmadd213ps_avx512vl(auVar100,local_140,auVar98);
          auVar96 = vfmadd213ps_avx512vl(auVar96,local_120,auVar100);
          auVar82 = vfmadd213ps_avx512vl(auVar94,local_100,auVar96);
          auVar94 = *(undefined1 (*) [32])(lVar66 + 0x220557c + lVar61 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar66 + 0x2205a00 + lVar61 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar66 + 0x2205e84 + lVar61 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar66 + 0x2206308 + lVar61 * 4);
          auVar83 = vmulps_avx512vl(local_5a0,auVar98);
          auVar99 = vmulps_avx512vl(local_5c0,auVar98);
          auVar98 = vmulps_avx512vl(local_560,auVar98);
          auVar83 = vfmadd231ps_avx512vl(auVar83,auVar100,local_580);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar100,auVar102);
          auVar100 = vfmadd231ps_avx512vl(auVar98,local_140,auVar100);
          auVar98 = vfmadd231ps_avx512vl(auVar83,auVar96,auVar93);
          auVar83 = vfmadd231ps_avx512vl(auVar99,auVar96,auVar92);
          auVar96 = vfmadd231ps_avx512vl(auVar100,local_120,auVar96);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,auVar101);
          auVar83 = vfmadd231ps_avx512vl(auVar83,auVar94,local_4a0);
          auVar99 = vfmadd231ps_avx512vl(auVar96,local_100,auVar94);
          auVar94 = *(undefined1 (*) [32])(lVar66 + 0x220799c + lVar61 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar66 + 0x22082a4 + lVar61 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar66 + 0x2208728 + lVar61 * 4);
          auVar89 = vmulps_avx512vl(local_5a0,auVar100);
          auVar90 = vmulps_avx512vl(local_5c0,auVar100);
          auVar100 = vmulps_avx512vl(local_560,auVar100);
          auVar89 = vfmadd231ps_avx512vl(auVar89,auVar96,local_580);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar96,auVar102);
          auVar100 = vfmadd231ps_avx512vl(auVar100,local_140,auVar96);
          auVar96 = *(undefined1 (*) [32])(lVar66 + 0x2207e20 + lVar61 * 4);
          auVar89 = vfmadd231ps_avx512vl(auVar89,auVar96,auVar93);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar96,auVar92);
          auVar96 = vfmadd231ps_avx512vl(auVar100,local_120,auVar96);
          auVar100 = vfmadd231ps_avx512vl(auVar89,auVar94,auVar101);
          auVar89 = vfmadd231ps_avx512vl(auVar90,auVar94,local_4a0);
          auVar96 = vfmadd231ps_avx512vl(auVar96,local_100,auVar94);
          auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar98,auVar90);
          vandps_avx512vl(auVar83,auVar90);
          auVar94 = vmaxps_avx(auVar90,auVar90);
          vandps_avx512vl(auVar99,auVar90);
          auVar94 = vmaxps_avx(auVar94,auVar90);
          uVar63 = vcmpps_avx512vl(auVar94,local_500,1);
          bVar12 = (bool)((byte)uVar63 & 1);
          auVar109._0_4_ = (float)((uint)bVar12 * auVar95._0_4_ | (uint)!bVar12 * auVar98._0_4_);
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar109._4_4_ = (float)((uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar98._4_4_);
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar109._8_4_ = (float)((uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar98._8_4_);
          bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar109._12_4_ = (float)((uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar98._12_4_);
          bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar109._16_4_ = (float)((uint)bVar12 * auVar95._16_4_ | (uint)!bVar12 * auVar98._16_4_);
          bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar109._20_4_ = (float)((uint)bVar12 * auVar95._20_4_ | (uint)!bVar12 * auVar98._20_4_);
          bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar109._24_4_ = (float)((uint)bVar12 * auVar95._24_4_ | (uint)!bVar12 * auVar98._24_4_);
          bVar12 = SUB81(uVar63 >> 7,0);
          auVar109._28_4_ = (uint)bVar12 * auVar95._28_4_ | (uint)!bVar12 * auVar98._28_4_;
          bVar12 = (bool)((byte)uVar63 & 1);
          auVar110._0_4_ = (float)((uint)bVar12 * auVar84._0_4_ | (uint)!bVar12 * auVar83._0_4_);
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar110._4_4_ = (float)((uint)bVar12 * auVar84._4_4_ | (uint)!bVar12 * auVar83._4_4_);
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar110._8_4_ = (float)((uint)bVar12 * auVar84._8_4_ | (uint)!bVar12 * auVar83._8_4_);
          bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar110._12_4_ = (float)((uint)bVar12 * auVar84._12_4_ | (uint)!bVar12 * auVar83._12_4_);
          bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar110._16_4_ = (float)((uint)bVar12 * auVar84._16_4_ | (uint)!bVar12 * auVar83._16_4_);
          bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar110._20_4_ = (float)((uint)bVar12 * auVar84._20_4_ | (uint)!bVar12 * auVar83._20_4_);
          bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar110._24_4_ = (float)((uint)bVar12 * auVar84._24_4_ | (uint)!bVar12 * auVar83._24_4_);
          bVar12 = SUB81(uVar63 >> 7,0);
          auVar110._28_4_ = (uint)bVar12 * auVar84._28_4_ | (uint)!bVar12 * auVar83._28_4_;
          vandps_avx512vl(auVar100,auVar90);
          vandps_avx512vl(auVar89,auVar90);
          auVar94 = vmaxps_avx(auVar110,auVar110);
          vandps_avx512vl(auVar96,auVar90);
          auVar94 = vmaxps_avx(auVar94,auVar110);
          uVar63 = vcmpps_avx512vl(auVar94,local_500,1);
          bVar12 = (bool)((byte)uVar63 & 1);
          auVar111._0_4_ = (uint)bVar12 * auVar95._0_4_ | (uint)!bVar12 * auVar100._0_4_;
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar111._4_4_ = (uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar100._4_4_;
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar111._8_4_ = (uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar100._8_4_;
          bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar111._12_4_ = (uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar100._12_4_;
          bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar111._16_4_ = (uint)bVar12 * auVar95._16_4_ | (uint)!bVar12 * auVar100._16_4_;
          bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar111._20_4_ = (uint)bVar12 * auVar95._20_4_ | (uint)!bVar12 * auVar100._20_4_;
          bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar111._24_4_ = (uint)bVar12 * auVar95._24_4_ | (uint)!bVar12 * auVar100._24_4_;
          bVar12 = SUB81(uVar63 >> 7,0);
          auVar111._28_4_ = (uint)bVar12 * auVar95._28_4_ | (uint)!bVar12 * auVar100._28_4_;
          bVar12 = (bool)((byte)uVar63 & 1);
          auVar112._0_4_ = (float)((uint)bVar12 * auVar84._0_4_ | (uint)!bVar12 * auVar89._0_4_);
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar112._4_4_ = (float)((uint)bVar12 * auVar84._4_4_ | (uint)!bVar12 * auVar89._4_4_);
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar112._8_4_ = (float)((uint)bVar12 * auVar84._8_4_ | (uint)!bVar12 * auVar89._8_4_);
          bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar112._12_4_ = (float)((uint)bVar12 * auVar84._12_4_ | (uint)!bVar12 * auVar89._12_4_);
          bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar112._16_4_ = (float)((uint)bVar12 * auVar84._16_4_ | (uint)!bVar12 * auVar89._16_4_);
          bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar112._20_4_ = (float)((uint)bVar12 * auVar84._20_4_ | (uint)!bVar12 * auVar89._20_4_);
          bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar112._24_4_ = (float)((uint)bVar12 * auVar84._24_4_ | (uint)!bVar12 * auVar89._24_4_);
          bVar12 = SUB81(uVar63 >> 7,0);
          auVar112._28_4_ = (uint)bVar12 * auVar84._28_4_ | (uint)!bVar12 * auVar89._28_4_;
          auVar178._8_4_ = 0x80000000;
          auVar178._0_8_ = 0x8000000080000000;
          auVar178._12_4_ = 0x80000000;
          auVar178._16_4_ = 0x80000000;
          auVar178._20_4_ = 0x80000000;
          auVar178._24_4_ = 0x80000000;
          auVar178._28_4_ = 0x80000000;
          auVar94 = vxorps_avx512vl(auVar111,auVar178);
          auVar89 = auVar189._0_32_;
          auVar96 = vfmadd213ps_avx512vl(auVar109,auVar109,auVar89);
          auVar20 = vfmadd231ps_fma(auVar96,auVar110,auVar110);
          auVar96 = vrsqrt14ps_avx512vl(ZEXT1632(auVar20));
          auVar185._8_4_ = 0xbf000000;
          auVar185._0_8_ = 0xbf000000bf000000;
          auVar185._12_4_ = 0xbf000000;
          auVar185._16_4_ = 0xbf000000;
          auVar185._20_4_ = 0xbf000000;
          auVar185._24_4_ = 0xbf000000;
          auVar185._28_4_ = 0xbf000000;
          fVar144 = auVar96._0_4_;
          fVar133 = auVar96._4_4_;
          fVar134 = auVar96._8_4_;
          fVar135 = auVar96._12_4_;
          fVar168 = auVar96._16_4_;
          fVar172 = auVar96._20_4_;
          fVar69 = auVar96._24_4_;
          auVar40._4_4_ = fVar133 * fVar133 * fVar133 * auVar20._4_4_ * -0.5;
          auVar40._0_4_ = fVar144 * fVar144 * fVar144 * auVar20._0_4_ * -0.5;
          auVar40._8_4_ = fVar134 * fVar134 * fVar134 * auVar20._8_4_ * -0.5;
          auVar40._12_4_ = fVar135 * fVar135 * fVar135 * auVar20._12_4_ * -0.5;
          auVar40._16_4_ = fVar168 * fVar168 * fVar168 * -0.0;
          auVar40._20_4_ = fVar172 * fVar172 * fVar172 * -0.0;
          auVar40._24_4_ = fVar69 * fVar69 * fVar69 * -0.0;
          auVar40._28_4_ = auVar110._28_4_;
          auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar96 = vfmadd231ps_avx512vl(auVar40,auVar100,auVar96);
          auVar41._4_4_ = auVar110._4_4_ * auVar96._4_4_;
          auVar41._0_4_ = auVar110._0_4_ * auVar96._0_4_;
          auVar41._8_4_ = auVar110._8_4_ * auVar96._8_4_;
          auVar41._12_4_ = auVar110._12_4_ * auVar96._12_4_;
          auVar41._16_4_ = auVar110._16_4_ * auVar96._16_4_;
          auVar41._20_4_ = auVar110._20_4_ * auVar96._20_4_;
          auVar41._24_4_ = auVar110._24_4_ * auVar96._24_4_;
          auVar41._28_4_ = 0;
          auVar42._4_4_ = auVar96._4_4_ * -auVar109._4_4_;
          auVar42._0_4_ = auVar96._0_4_ * -auVar109._0_4_;
          auVar42._8_4_ = auVar96._8_4_ * -auVar109._8_4_;
          auVar42._12_4_ = auVar96._12_4_ * -auVar109._12_4_;
          auVar42._16_4_ = auVar96._16_4_ * -auVar109._16_4_;
          auVar42._20_4_ = auVar96._20_4_ * -auVar109._20_4_;
          auVar42._24_4_ = auVar96._24_4_ * -auVar109._24_4_;
          auVar42._28_4_ = auVar110._28_4_;
          auVar98 = vmulps_avx512vl(auVar96,auVar89);
          auVar96 = vfmadd213ps_avx512vl(auVar111,auVar111,auVar89);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar112,auVar112);
          auVar83 = vrsqrt14ps_avx512vl(auVar96);
          auVar96 = vmulps_avx512vl(auVar96,auVar185);
          fVar144 = auVar83._0_4_;
          fVar133 = auVar83._4_4_;
          fVar134 = auVar83._8_4_;
          fVar135 = auVar83._12_4_;
          fVar168 = auVar83._16_4_;
          fVar172 = auVar83._20_4_;
          fVar69 = auVar83._24_4_;
          auVar43._4_4_ = fVar133 * fVar133 * fVar133 * auVar96._4_4_;
          auVar43._0_4_ = fVar144 * fVar144 * fVar144 * auVar96._0_4_;
          auVar43._8_4_ = fVar134 * fVar134 * fVar134 * auVar96._8_4_;
          auVar43._12_4_ = fVar135 * fVar135 * fVar135 * auVar96._12_4_;
          auVar43._16_4_ = fVar168 * fVar168 * fVar168 * auVar96._16_4_;
          auVar43._20_4_ = fVar172 * fVar172 * fVar172 * auVar96._20_4_;
          auVar43._24_4_ = fVar69 * fVar69 * fVar69 * auVar96._24_4_;
          auVar43._28_4_ = auVar96._28_4_;
          auVar96 = vfmadd231ps_avx512vl(auVar43,auVar100,auVar83);
          auVar44._4_4_ = auVar112._4_4_ * auVar96._4_4_;
          auVar44._0_4_ = auVar112._0_4_ * auVar96._0_4_;
          auVar44._8_4_ = auVar112._8_4_ * auVar96._8_4_;
          auVar44._12_4_ = auVar112._12_4_ * auVar96._12_4_;
          auVar44._16_4_ = auVar112._16_4_ * auVar96._16_4_;
          auVar44._20_4_ = auVar112._20_4_ * auVar96._20_4_;
          auVar44._24_4_ = auVar112._24_4_ * auVar96._24_4_;
          auVar44._28_4_ = auVar83._28_4_;
          auVar45._4_4_ = auVar96._4_4_ * auVar94._4_4_;
          auVar45._0_4_ = auVar96._0_4_ * auVar94._0_4_;
          auVar45._8_4_ = auVar96._8_4_ * auVar94._8_4_;
          auVar45._12_4_ = auVar96._12_4_ * auVar94._12_4_;
          auVar45._16_4_ = auVar96._16_4_ * auVar94._16_4_;
          auVar45._20_4_ = auVar96._20_4_ * auVar94._20_4_;
          auVar45._24_4_ = auVar96._24_4_ * auVar94._24_4_;
          auVar45._28_4_ = auVar94._28_4_;
          auVar94 = vmulps_avx512vl(auVar96,auVar89);
          auVar20 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar77),auVar85);
          auVar96 = ZEXT1632(auVar77);
          auVar21 = vfmadd213ps_fma(auVar42,auVar96,auVar86);
          auVar100 = vfmadd213ps_avx512vl(auVar98,auVar96,auVar82);
          auVar83 = vfmadd213ps_avx512vl(auVar44,ZEXT1632(auVar71),auVar87);
          auVar76 = vfnmadd213ps_fma(auVar41,auVar96,auVar85);
          auVar99 = ZEXT1632(auVar71);
          auVar23 = vfmadd213ps_fma(auVar45,auVar99,auVar88);
          auVar75 = vfnmadd213ps_fma(auVar42,auVar96,auVar86);
          auVar73 = vfmadd213ps_fma(auVar94,auVar99,auVar97);
          auVar86 = ZEXT1632(auVar77);
          auVar130 = vfnmadd231ps_fma(auVar82,auVar86,auVar98);
          auVar80 = vfnmadd213ps_fma(auVar44,auVar99,auVar87);
          auVar129 = vfnmadd213ps_fma(auVar45,auVar99,auVar88);
          auVar137 = vfnmadd231ps_fma(auVar97,ZEXT1632(auVar71),auVar94);
          auVar97 = vsubps_avx512vl(auVar83,ZEXT1632(auVar76));
          auVar94 = vsubps_avx(ZEXT1632(auVar23),ZEXT1632(auVar75));
          auVar96 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar130));
          auVar46._4_4_ = auVar94._4_4_ * auVar130._4_4_;
          auVar46._0_4_ = auVar94._0_4_ * auVar130._0_4_;
          auVar46._8_4_ = auVar94._8_4_ * auVar130._8_4_;
          auVar46._12_4_ = auVar94._12_4_ * auVar130._12_4_;
          auVar46._16_4_ = auVar94._16_4_ * 0.0;
          auVar46._20_4_ = auVar94._20_4_ * 0.0;
          auVar46._24_4_ = auVar94._24_4_ * 0.0;
          auVar46._28_4_ = auVar98._28_4_;
          auVar77 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar75),auVar96);
          auVar47._4_4_ = auVar96._4_4_ * auVar76._4_4_;
          auVar47._0_4_ = auVar96._0_4_ * auVar76._0_4_;
          auVar47._8_4_ = auVar96._8_4_ * auVar76._8_4_;
          auVar47._12_4_ = auVar96._12_4_ * auVar76._12_4_;
          auVar47._16_4_ = auVar96._16_4_ * 0.0;
          auVar47._20_4_ = auVar96._20_4_ * 0.0;
          auVar47._24_4_ = auVar96._24_4_ * 0.0;
          auVar47._28_4_ = auVar96._28_4_;
          auVar79 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar130),auVar97);
          auVar48._4_4_ = auVar75._4_4_ * auVar97._4_4_;
          auVar48._0_4_ = auVar75._0_4_ * auVar97._0_4_;
          auVar48._8_4_ = auVar75._8_4_ * auVar97._8_4_;
          auVar48._12_4_ = auVar75._12_4_ * auVar97._12_4_;
          auVar48._16_4_ = auVar97._16_4_ * 0.0;
          auVar48._20_4_ = auVar97._20_4_ * 0.0;
          auVar48._24_4_ = auVar97._24_4_ * 0.0;
          auVar48._28_4_ = auVar97._28_4_;
          auVar74 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar76),auVar94);
          auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar89,ZEXT1632(auVar79));
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,ZEXT1632(auVar77));
          uVar63 = vcmpps_avx512vl(auVar94,auVar89,2);
          bVar60 = (byte)uVar63;
          fVar120 = (float)((uint)(bVar60 & 1) * auVar20._0_4_ |
                           (uint)!(bool)(bVar60 & 1) * auVar80._0_4_);
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          fVar122 = (float)((uint)bVar12 * auVar20._4_4_ | (uint)!bVar12 * auVar80._4_4_);
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          fVar125 = (float)((uint)bVar12 * auVar20._8_4_ | (uint)!bVar12 * auVar80._8_4_);
          bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
          fVar126 = (float)((uint)bVar12 * auVar20._12_4_ | (uint)!bVar12 * auVar80._12_4_);
          auVar99 = ZEXT1632(CONCAT412(fVar126,CONCAT48(fVar125,CONCAT44(fVar122,fVar120))));
          fVar121 = (float)((uint)(bVar60 & 1) * auVar21._0_4_ |
                           (uint)!(bool)(bVar60 & 1) * auVar129._0_4_);
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          fVar124 = (float)((uint)bVar12 * auVar21._4_4_ | (uint)!bVar12 * auVar129._4_4_);
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          fVar123 = (float)((uint)bVar12 * auVar21._8_4_ | (uint)!bVar12 * auVar129._8_4_);
          bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
          fVar127 = (float)((uint)bVar12 * auVar21._12_4_ | (uint)!bVar12 * auVar129._12_4_);
          auVar95 = ZEXT1632(CONCAT412(fVar127,CONCAT48(fVar123,CONCAT44(fVar124,fVar121))));
          auVar113._0_4_ =
               (float)((uint)(bVar60 & 1) * auVar100._0_4_ |
                      (uint)!(bool)(bVar60 & 1) * auVar137._0_4_);
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar113._4_4_ = (float)((uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar137._4_4_);
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar113._8_4_ = (float)((uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar137._8_4_);
          bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar113._12_4_ =
               (float)((uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar137._12_4_);
          fVar144 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar100._16_4_);
          auVar113._16_4_ = fVar144;
          fVar133 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar100._20_4_);
          auVar113._20_4_ = fVar133;
          fVar134 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar100._24_4_);
          auVar113._24_4_ = fVar134;
          iVar1 = (uint)(byte)(uVar63 >> 7) * auVar100._28_4_;
          auVar113._28_4_ = iVar1;
          auVar94 = vblendmps_avx512vl(ZEXT1632(auVar76),auVar83);
          auVar114._0_4_ =
               (uint)(bVar60 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar77._0_4_;
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar114._4_4_ = (uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar77._4_4_;
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar114._8_4_ = (uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar77._8_4_;
          bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar114._12_4_ = (uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar77._12_4_;
          auVar114._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * auVar94._16_4_;
          auVar114._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * auVar94._20_4_;
          auVar114._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * auVar94._24_4_;
          auVar114._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar94._28_4_;
          auVar94 = vblendmps_avx512vl(ZEXT1632(auVar75),ZEXT1632(auVar23));
          auVar115._0_4_ =
               (float)((uint)(bVar60 & 1) * auVar94._0_4_ |
                      (uint)!(bool)(bVar60 & 1) * auVar20._0_4_);
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar115._4_4_ = (float)((uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar20._4_4_);
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar115._8_4_ = (float)((uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar20._8_4_);
          bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar115._12_4_ = (float)((uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar20._12_4_);
          fVar135 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar94._16_4_);
          auVar115._16_4_ = fVar135;
          fVar168 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar94._20_4_);
          auVar115._20_4_ = fVar168;
          fVar172 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar94._24_4_);
          auVar115._24_4_ = fVar172;
          auVar115._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar94._28_4_;
          auVar94 = vblendmps_avx512vl(ZEXT1632(auVar130),ZEXT1632(auVar73));
          auVar116._0_4_ =
               (float)((uint)(bVar60 & 1) * auVar94._0_4_ |
                      (uint)!(bool)(bVar60 & 1) * auVar21._0_4_);
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar116._4_4_ = (float)((uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar21._4_4_);
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar116._8_4_ = (float)((uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar21._8_4_);
          bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar116._12_4_ = (float)((uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar21._12_4_);
          fVar69 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar94._16_4_);
          auVar116._16_4_ = fVar69;
          fVar70 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar94._20_4_);
          auVar116._20_4_ = fVar70;
          fVar119 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar94._24_4_);
          auVar116._24_4_ = fVar119;
          iVar2 = (uint)(byte)(uVar63 >> 7) * auVar94._28_4_;
          auVar116._28_4_ = iVar2;
          auVar117._0_4_ =
               (uint)(bVar60 & 1) * (int)auVar76._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar83._0_4_;
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar117._4_4_ = (uint)bVar12 * (int)auVar76._4_4_ | (uint)!bVar12 * auVar83._4_4_;
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar117._8_4_ = (uint)bVar12 * (int)auVar76._8_4_ | (uint)!bVar12 * auVar83._8_4_;
          bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar117._12_4_ = (uint)bVar12 * (int)auVar76._12_4_ | (uint)!bVar12 * auVar83._12_4_;
          auVar117._16_4_ = (uint)!(bool)((byte)(uVar63 >> 4) & 1) * auVar83._16_4_;
          auVar117._20_4_ = (uint)!(bool)((byte)(uVar63 >> 5) & 1) * auVar83._20_4_;
          auVar117._24_4_ = (uint)!(bool)((byte)(uVar63 >> 6) & 1) * auVar83._24_4_;
          auVar117._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar83._28_4_;
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar63 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar63 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar63 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar63 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar83 = vsubps_avx512vl(auVar117,auVar99);
          auVar96 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar75._12_4_ |
                                                  (uint)!bVar16 * auVar23._12_4_,
                                                  CONCAT48((uint)bVar15 * (int)auVar75._8_4_ |
                                                           (uint)!bVar15 * auVar23._8_4_,
                                                           CONCAT44((uint)bVar12 *
                                                                    (int)auVar75._4_4_ |
                                                                    (uint)!bVar12 * auVar23._4_4_,
                                                                    (uint)(bVar60 & 1) *
                                                                    (int)auVar75._0_4_ |
                                                                    (uint)!(bool)(bVar60 & 1) *
                                                                    auVar23._0_4_)))),auVar95);
          auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar130._12_4_ |
                                                   (uint)!bVar17 * auVar73._12_4_,
                                                   CONCAT48((uint)bVar14 * (int)auVar130._8_4_ |
                                                            (uint)!bVar14 * auVar73._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar130._4_4_ |
                                                                     (uint)!bVar13 * auVar73._4_4_,
                                                                     (uint)(bVar60 & 1) *
                                                                     (int)auVar130._0_4_ |
                                                                     (uint)!(bool)(bVar60 & 1) *
                                                                     auVar73._0_4_)))),auVar113);
          auVar98 = vsubps_avx(auVar99,auVar114);
          auVar97 = vsubps_avx(auVar95,auVar115);
          auVar82 = vsubps_avx(auVar113,auVar116);
          auVar49._4_4_ = auVar100._4_4_ * fVar122;
          auVar49._0_4_ = auVar100._0_4_ * fVar120;
          auVar49._8_4_ = auVar100._8_4_ * fVar125;
          auVar49._12_4_ = auVar100._12_4_ * fVar126;
          auVar49._16_4_ = auVar100._16_4_ * 0.0;
          auVar49._20_4_ = auVar100._20_4_ * 0.0;
          auVar49._24_4_ = auVar100._24_4_ * 0.0;
          auVar49._28_4_ = 0;
          auVar77 = vfmsub231ps_fma(auVar49,auVar113,auVar83);
          auVar154._0_4_ = fVar121 * auVar83._0_4_;
          auVar154._4_4_ = fVar124 * auVar83._4_4_;
          auVar154._8_4_ = fVar123 * auVar83._8_4_;
          auVar154._12_4_ = fVar127 * auVar83._12_4_;
          auVar154._16_4_ = auVar83._16_4_ * 0.0;
          auVar154._20_4_ = auVar83._20_4_ * 0.0;
          auVar154._24_4_ = auVar83._24_4_ * 0.0;
          auVar154._28_4_ = 0;
          auVar20 = vfmsub231ps_fma(auVar154,auVar99,auVar96);
          auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar20),auVar89,ZEXT1632(auVar77));
          auVar160._0_4_ = auVar96._0_4_ * auVar113._0_4_;
          auVar160._4_4_ = auVar96._4_4_ * auVar113._4_4_;
          auVar160._8_4_ = auVar96._8_4_ * auVar113._8_4_;
          auVar160._12_4_ = auVar96._12_4_ * auVar113._12_4_;
          auVar160._16_4_ = auVar96._16_4_ * fVar144;
          auVar160._20_4_ = auVar96._20_4_ * fVar133;
          auVar160._24_4_ = auVar96._24_4_ * fVar134;
          auVar160._28_4_ = 0;
          auVar77 = vfmsub231ps_fma(auVar160,auVar95,auVar100);
          auVar84 = vfmadd231ps_avx512vl(auVar94,auVar89,ZEXT1632(auVar77));
          auVar94 = vmulps_avx512vl(auVar82,auVar114);
          auVar94 = vfmsub231ps_avx512vl(auVar94,auVar98,auVar116);
          auVar50._4_4_ = auVar97._4_4_ * auVar116._4_4_;
          auVar50._0_4_ = auVar97._0_4_ * auVar116._0_4_;
          auVar50._8_4_ = auVar97._8_4_ * auVar116._8_4_;
          auVar50._12_4_ = auVar97._12_4_ * auVar116._12_4_;
          auVar50._16_4_ = auVar97._16_4_ * fVar69;
          auVar50._20_4_ = auVar97._20_4_ * fVar70;
          auVar50._24_4_ = auVar97._24_4_ * fVar119;
          auVar50._28_4_ = iVar2;
          auVar77 = vfmsub231ps_fma(auVar50,auVar115,auVar82);
          auVar161._0_4_ = auVar115._0_4_ * auVar98._0_4_;
          auVar161._4_4_ = auVar115._4_4_ * auVar98._4_4_;
          auVar161._8_4_ = auVar115._8_4_ * auVar98._8_4_;
          auVar161._12_4_ = auVar115._12_4_ * auVar98._12_4_;
          auVar161._16_4_ = fVar135 * auVar98._16_4_;
          auVar161._20_4_ = fVar168 * auVar98._20_4_;
          auVar161._24_4_ = fVar172 * auVar98._24_4_;
          auVar161._28_4_ = 0;
          auVar20 = vfmsub231ps_fma(auVar161,auVar97,auVar114);
          auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar20),auVar89,auVar94);
          auVar85 = vfmadd231ps_avx512vl(auVar94,auVar89,ZEXT1632(auVar77));
          auVar94 = vmaxps_avx(auVar84,auVar85);
          uVar136 = vcmpps_avx512vl(auVar94,auVar89,2);
          bVar68 = bVar68 & (byte)uVar136;
          if (bVar68 != 0) {
            auVar51._4_4_ = auVar82._4_4_ * auVar96._4_4_;
            auVar51._0_4_ = auVar82._0_4_ * auVar96._0_4_;
            auVar51._8_4_ = auVar82._8_4_ * auVar96._8_4_;
            auVar51._12_4_ = auVar82._12_4_ * auVar96._12_4_;
            auVar51._16_4_ = auVar82._16_4_ * auVar96._16_4_;
            auVar51._20_4_ = auVar82._20_4_ * auVar96._20_4_;
            auVar51._24_4_ = auVar82._24_4_ * auVar96._24_4_;
            auVar51._28_4_ = auVar94._28_4_;
            auVar21 = vfmsub231ps_fma(auVar51,auVar97,auVar100);
            auVar52._4_4_ = auVar100._4_4_ * auVar98._4_4_;
            auVar52._0_4_ = auVar100._0_4_ * auVar98._0_4_;
            auVar52._8_4_ = auVar100._8_4_ * auVar98._8_4_;
            auVar52._12_4_ = auVar100._12_4_ * auVar98._12_4_;
            auVar52._16_4_ = auVar100._16_4_ * auVar98._16_4_;
            auVar52._20_4_ = auVar100._20_4_ * auVar98._20_4_;
            auVar52._24_4_ = auVar100._24_4_ * auVar98._24_4_;
            auVar52._28_4_ = auVar100._28_4_;
            auVar20 = vfmsub231ps_fma(auVar52,auVar83,auVar82);
            auVar53._4_4_ = auVar97._4_4_ * auVar83._4_4_;
            auVar53._0_4_ = auVar97._0_4_ * auVar83._0_4_;
            auVar53._8_4_ = auVar97._8_4_ * auVar83._8_4_;
            auVar53._12_4_ = auVar97._12_4_ * auVar83._12_4_;
            auVar53._16_4_ = auVar97._16_4_ * auVar83._16_4_;
            auVar53._20_4_ = auVar97._20_4_ * auVar83._20_4_;
            auVar53._24_4_ = auVar97._24_4_ * auVar83._24_4_;
            auVar53._28_4_ = auVar97._28_4_;
            auVar23 = vfmsub231ps_fma(auVar53,auVar98,auVar96);
            auVar77 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar20),ZEXT1632(auVar23));
            auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar21),auVar89);
            auVar96 = vrcp14ps_avx512vl(auVar94);
            auVar98 = auVar188._0_32_;
            auVar100 = vfnmadd213ps_avx512vl(auVar96,auVar94,auVar98);
            auVar77 = vfmadd132ps_fma(auVar100,auVar96,auVar96);
            auVar54._4_4_ = auVar23._4_4_ * auVar113._4_4_;
            auVar54._0_4_ = auVar23._0_4_ * auVar113._0_4_;
            auVar54._8_4_ = auVar23._8_4_ * auVar113._8_4_;
            auVar54._12_4_ = auVar23._12_4_ * auVar113._12_4_;
            auVar54._16_4_ = fVar144 * 0.0;
            auVar54._20_4_ = fVar133 * 0.0;
            auVar54._24_4_ = fVar134 * 0.0;
            auVar54._28_4_ = iVar1;
            auVar20 = vfmadd231ps_fma(auVar54,auVar95,ZEXT1632(auVar20));
            auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar99,ZEXT1632(auVar21));
            fVar144 = auVar77._0_4_;
            fVar133 = auVar77._4_4_;
            fVar134 = auVar77._8_4_;
            fVar135 = auVar77._12_4_;
            local_380 = ZEXT1632(CONCAT412(auVar20._12_4_ * fVar135,
                                           CONCAT48(auVar20._8_4_ * fVar134,
                                                    CONCAT44(auVar20._4_4_ * fVar133,
                                                             auVar20._0_4_ * fVar144))));
            auVar59._4_4_ = uStack_3fc;
            auVar59._0_4_ = local_400;
            auVar59._8_4_ = uStack_3f8;
            auVar59._12_4_ = uStack_3f4;
            auVar59._16_4_ = uStack_3f0;
            auVar59._20_4_ = uStack_3ec;
            auVar59._24_4_ = uStack_3e8;
            auVar59._28_4_ = uStack_3e4;
            uVar136 = vcmpps_avx512vl(local_380,auVar59,0xd);
            uVar128 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar30._4_4_ = uVar128;
            auVar30._0_4_ = uVar128;
            auVar30._8_4_ = uVar128;
            auVar30._12_4_ = uVar128;
            auVar30._16_4_ = uVar128;
            auVar30._20_4_ = uVar128;
            auVar30._24_4_ = uVar128;
            auVar30._28_4_ = uVar128;
            uVar25 = vcmpps_avx512vl(local_380,auVar30,2);
            bVar68 = (byte)uVar136 & (byte)uVar25 & bVar68;
            if (bVar68 != 0) {
              uVar136 = vcmpps_avx512vl(auVar94,auVar89,4);
              bVar68 = bVar68 & (byte)uVar136;
              auVar187 = ZEXT3264(local_600);
              auVar186 = ZEXT3264(local_5e0);
              if (bVar68 != 0) {
                fVar168 = auVar84._0_4_ * fVar144;
                fVar172 = auVar84._4_4_ * fVar133;
                auVar55._4_4_ = fVar172;
                auVar55._0_4_ = fVar168;
                fVar69 = auVar84._8_4_ * fVar134;
                auVar55._8_4_ = fVar69;
                fVar70 = auVar84._12_4_ * fVar135;
                auVar55._12_4_ = fVar70;
                fVar119 = auVar84._16_4_ * 0.0;
                auVar55._16_4_ = fVar119;
                fVar120 = auVar84._20_4_ * 0.0;
                auVar55._20_4_ = fVar120;
                fVar121 = auVar84._24_4_ * 0.0;
                auVar55._24_4_ = fVar121;
                auVar55._28_4_ = auVar94._28_4_;
                auVar96 = vsubps_avx512vl(auVar98,auVar55);
                local_3c0._0_4_ =
                     (float)((uint)(bVar60 & 1) * (int)fVar168 |
                            (uint)!(bool)(bVar60 & 1) * auVar96._0_4_);
                bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
                local_3c0._4_4_ =
                     (float)((uint)bVar12 * (int)fVar172 | (uint)!bVar12 * auVar96._4_4_);
                bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
                local_3c0._8_4_ =
                     (float)((uint)bVar12 * (int)fVar69 | (uint)!bVar12 * auVar96._8_4_);
                bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
                local_3c0._12_4_ =
                     (float)((uint)bVar12 * (int)fVar70 | (uint)!bVar12 * auVar96._12_4_);
                bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
                local_3c0._16_4_ =
                     (float)((uint)bVar12 * (int)fVar119 | (uint)!bVar12 * auVar96._16_4_);
                bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
                local_3c0._20_4_ =
                     (float)((uint)bVar12 * (int)fVar120 | (uint)!bVar12 * auVar96._20_4_);
                bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
                local_3c0._24_4_ =
                     (float)((uint)bVar12 * (int)fVar121 | (uint)!bVar12 * auVar96._24_4_);
                bVar12 = SUB81(uVar63 >> 7,0);
                local_3c0._28_4_ =
                     (float)((uint)bVar12 * auVar94._28_4_ | (uint)!bVar12 * auVar96._28_4_);
                auVar94 = vsubps_avx(ZEXT1632(auVar71),auVar86);
                auVar77 = vfmadd213ps_fma(auVar94,local_3c0,auVar86);
                uVar128 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                auVar31._4_4_ = uVar128;
                auVar31._0_4_ = uVar128;
                auVar31._8_4_ = uVar128;
                auVar31._12_4_ = uVar128;
                auVar31._16_4_ = uVar128;
                auVar31._20_4_ = uVar128;
                auVar31._24_4_ = uVar128;
                auVar31._28_4_ = uVar128;
                auVar94 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar77._12_4_ + auVar77._12_4_,
                                                             CONCAT48(auVar77._8_4_ + auVar77._8_4_,
                                                                      CONCAT44(auVar77._4_4_ +
                                                                               auVar77._4_4_,
                                                                               auVar77._0_4_ +
                                                                               auVar77._0_4_)))),
                                          auVar31);
                uVar136 = vcmpps_avx512vl(local_380,auVar94,6);
                if (((byte)uVar136 & bVar68) != 0) {
                  auVar141._0_4_ = auVar85._0_4_ * fVar144;
                  auVar141._4_4_ = auVar85._4_4_ * fVar133;
                  auVar141._8_4_ = auVar85._8_4_ * fVar134;
                  auVar141._12_4_ = auVar85._12_4_ * fVar135;
                  auVar141._16_4_ = auVar85._16_4_ * 0.0;
                  auVar141._20_4_ = auVar85._20_4_ * 0.0;
                  auVar141._24_4_ = auVar85._24_4_ * 0.0;
                  auVar141._28_4_ = 0;
                  auVar94 = vsubps_avx512vl(auVar98,auVar141);
                  auVar118._0_4_ =
                       (uint)(bVar60 & 1) * (int)auVar141._0_4_ |
                       (uint)!(bool)(bVar60 & 1) * auVar94._0_4_;
                  bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
                  auVar118._4_4_ =
                       (uint)bVar12 * (int)auVar141._4_4_ | (uint)!bVar12 * auVar94._4_4_;
                  bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
                  auVar118._8_4_ =
                       (uint)bVar12 * (int)auVar141._8_4_ | (uint)!bVar12 * auVar94._8_4_;
                  bVar12 = (bool)((byte)(uVar63 >> 3) & 1);
                  auVar118._12_4_ =
                       (uint)bVar12 * (int)auVar141._12_4_ | (uint)!bVar12 * auVar94._12_4_;
                  bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
                  auVar118._16_4_ =
                       (uint)bVar12 * (int)auVar141._16_4_ | (uint)!bVar12 * auVar94._16_4_;
                  bVar12 = (bool)((byte)(uVar63 >> 5) & 1);
                  auVar118._20_4_ =
                       (uint)bVar12 * (int)auVar141._20_4_ | (uint)!bVar12 * auVar94._20_4_;
                  bVar12 = (bool)((byte)(uVar63 >> 6) & 1);
                  auVar118._24_4_ =
                       (uint)bVar12 * (int)auVar141._24_4_ | (uint)!bVar12 * auVar94._24_4_;
                  auVar118._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar94._28_4_;
                  auVar32._8_4_ = 0x40000000;
                  auVar32._0_8_ = 0x4000000040000000;
                  auVar32._12_4_ = 0x40000000;
                  auVar32._16_4_ = 0x40000000;
                  auVar32._20_4_ = 0x40000000;
                  auVar32._24_4_ = 0x40000000;
                  auVar32._28_4_ = 0x40000000;
                  local_3a0 = vfmsub132ps_avx512vl(auVar118,auVar98,auVar32);
                  local_360 = (undefined4)lVar61;
                  pGVar10 = (context->scene->geometries).items[uVar8].ptr;
                  if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                    bVar60 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar60 = 1, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar77 = vcvtsi2ss_avx512f(auVar188._0_16_,local_360);
                    fVar144 = auVar77._0_4_;
                    local_300[0] = (fVar144 + local_3c0._0_4_ + 0.0) * (float)local_440;
                    local_300[1] = (fVar144 + local_3c0._4_4_ + 1.0) * local_440._4_4_;
                    local_300[2] = (fVar144 + local_3c0._8_4_ + 2.0) * fStack_438;
                    local_300[3] = (fVar144 + local_3c0._12_4_ + 3.0) * fStack_434;
                    fStack_2f0 = (fVar144 + local_3c0._16_4_ + 4.0) * fStack_430;
                    fStack_2ec = (fVar144 + local_3c0._20_4_ + 5.0) * fStack_42c;
                    fStack_2e8 = (fVar144 + local_3c0._24_4_ + 6.0) * fStack_428;
                    fStack_2e4 = fVar144 + local_3c0._28_4_ + 7.0;
                    local_2e0 = local_3a0;
                    local_2c0 = local_380;
                    uVar63 = 0;
                    uVar62 = (ulong)((byte)uVar136 & bVar68);
                    for (uVar65 = uVar62; local_35c = iVar9, local_350 = auVar78, local_340 = uVar24
                        , uStack_338 = uVar26, local_330 = uVar56, uStack_328 = uVar57,
                        (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
                      uVar63 = uVar63 + 1;
                    }
                    while (auVar77 = auVar189._0_16_, uVar62 != 0) {
                      uVar128 = *(undefined4 *)(ray + k * 4 + 0x100);
                      fVar144 = local_300[uVar63];
                      auVar140._4_4_ = fVar144;
                      auVar140._0_4_ = fVar144;
                      auVar140._8_4_ = fVar144;
                      auVar140._12_4_ = fVar144;
                      local_200._16_4_ = fVar144;
                      local_200._0_16_ = auVar140;
                      local_200._20_4_ = fVar144;
                      local_200._24_4_ = fVar144;
                      local_200._28_4_ = fVar144;
                      local_1e0 = *(undefined4 *)(local_2e0 + uVar63 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar63 * 4)
                      ;
                      local_630.context = context->user;
                      fVar133 = 1.0 - fVar144;
                      auVar21 = vfnmadd231ss_fma(ZEXT416((uint)(fVar144 * (fVar133 + fVar133))),
                                                 ZEXT416((uint)fVar133),ZEXT416((uint)fVar133));
                      auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar140,
                                                ZEXT416(0xc0a00000));
                      auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar144 * fVar144 * 3.0)),
                                                ZEXT416((uint)(fVar144 + fVar144)),auVar77);
                      auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar140,
                                                ZEXT416(0x40000000));
                      auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * fVar133 * -3.0)),
                                                ZEXT416((uint)(fVar133 + fVar133)),auVar77);
                      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar144 * fVar144)),auVar140,
                                                ZEXT416((uint)(fVar133 * -2.0)));
                      fVar144 = auVar21._0_4_ * 0.5;
                      fVar133 = auVar71._0_4_ * 0.5;
                      fVar134 = auVar77._0_4_ * 0.5;
                      fVar135 = auVar20._0_4_ * 0.5;
                      auVar152._0_4_ = fVar135 * local_520;
                      auVar152._4_4_ = fVar135 * fStack_51c;
                      auVar152._8_4_ = fVar135 * fStack_518;
                      auVar152._12_4_ = fVar135 * fStack_514;
                      auVar165._4_4_ = fVar134;
                      auVar165._0_4_ = fVar134;
                      auVar165._8_4_ = fVar134;
                      auVar165._12_4_ = fVar134;
                      auVar77 = vfmadd132ps_fma(auVar165,auVar152,auVar72);
                      auVar153._4_4_ = fVar133;
                      auVar153._0_4_ = fVar133;
                      auVar153._8_4_ = fVar133;
                      auVar153._12_4_ = fVar133;
                      auVar77 = vfmadd132ps_fma(auVar153,auVar77,auVar22);
                      auVar132._4_4_ = fVar144;
                      auVar132._0_4_ = fVar144;
                      auVar132._8_4_ = fVar144;
                      auVar132._12_4_ = fVar144;
                      auVar77 = vfmadd213ps_fma(auVar132,auVar78,auVar77);
                      local_260 = auVar77._0_4_;
                      auVar162._8_4_ = 1;
                      auVar162._0_8_ = 0x100000001;
                      auVar162._12_4_ = 1;
                      auVar162._16_4_ = 1;
                      auVar162._20_4_ = 1;
                      auVar162._24_4_ = 1;
                      auVar162._28_4_ = 1;
                      local_240 = vpermps_avx2(auVar162,ZEXT1632(auVar77));
                      auVar167._8_4_ = 2;
                      auVar167._0_8_ = 0x200000002;
                      auVar167._12_4_ = 2;
                      auVar167._16_4_ = 2;
                      auVar167._20_4_ = 2;
                      auVar167._24_4_ = 2;
                      auVar167._28_4_ = 2;
                      local_220 = vpermps_avx2(auVar167,ZEXT1632(auVar77));
                      uStack_25c = local_260;
                      uStack_258 = local_260;
                      uStack_254 = local_260;
                      uStack_250 = local_260;
                      uStack_24c = local_260;
                      uStack_248 = local_260;
                      uStack_244 = local_260;
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = local_280._0_8_;
                      uStack_1b8 = local_280._8_8_;
                      uStack_1b0 = local_280._16_8_;
                      uStack_1a8 = local_280._24_8_;
                      local_1a0 = local_420;
                      vpcmpeqd_avx2(local_420,local_420);
                      local_180 = (local_630.context)->instID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_160 = (local_630.context)->instPrimID[0];
                      uStack_15c = local_160;
                      uStack_158 = local_160;
                      uStack_154 = local_160;
                      uStack_150 = local_160;
                      uStack_14c = local_160;
                      uStack_148 = local_160;
                      uStack_144 = local_160;
                      local_540 = local_2a0;
                      local_630.valid = (int *)local_540;
                      local_630.geometryUserPtr = pGVar10->userPtr;
                      local_630.hit = (RTCHitN *)&local_260;
                      local_630.N = 8;
                      local_460._0_8_ = uVar63;
                      uVar65 = uVar63;
                      local_630.ray = (RTCRayN *)ray;
                      if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar10->occlusionFilterN)(&local_630);
                        uVar65 = local_460._0_8_;
                      }
                      if (local_540 != (undefined1  [32])0x0) {
                        p_Var11 = context->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var11)(&local_630);
                          uVar65 = local_460._0_8_;
                        }
                        auVar77 = auVar189._0_16_;
                        uVar63 = vptestmd_avx512vl(local_540,local_540);
                        auVar94 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar12 = (bool)((byte)uVar63 & 1);
                        bVar13 = (bool)((byte)(uVar63 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar63 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar63 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar63 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar63 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar63 >> 6) & 1);
                        bVar19 = SUB81(uVar63 >> 7,0);
                        *(uint *)(local_630.ray + 0x100) =
                             (uint)bVar12 * auVar94._0_4_ |
                             (uint)!bVar12 * *(int *)(local_630.ray + 0x100);
                        *(uint *)(local_630.ray + 0x104) =
                             (uint)bVar13 * auVar94._4_4_ |
                             (uint)!bVar13 * *(int *)(local_630.ray + 0x104);
                        *(uint *)(local_630.ray + 0x108) =
                             (uint)bVar15 * auVar94._8_4_ |
                             (uint)!bVar15 * *(int *)(local_630.ray + 0x108);
                        *(uint *)(local_630.ray + 0x10c) =
                             (uint)bVar14 * auVar94._12_4_ |
                             (uint)!bVar14 * *(int *)(local_630.ray + 0x10c);
                        *(uint *)(local_630.ray + 0x110) =
                             (uint)bVar16 * auVar94._16_4_ |
                             (uint)!bVar16 * *(int *)(local_630.ray + 0x110);
                        *(uint *)(local_630.ray + 0x114) =
                             (uint)bVar17 * auVar94._20_4_ |
                             (uint)!bVar17 * *(int *)(local_630.ray + 0x114);
                        *(uint *)(local_630.ray + 0x118) =
                             (uint)bVar18 * auVar94._24_4_ |
                             (uint)!bVar18 * *(int *)(local_630.ray + 0x118);
                        *(uint *)(local_630.ray + 0x11c) =
                             (uint)bVar19 * auVar94._28_4_ |
                             (uint)!bVar19 * *(int *)(local_630.ray + 0x11c);
                        if (local_540 != (undefined1  [32])0x0) {
                          bVar60 = 1;
                          goto LAB_0180918e;
                        }
                      }
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar128;
                      uVar63 = 0;
                      uVar62 = uVar62 ^ 1L << (uVar65 & 0x3f);
                      for (uVar65 = uVar62; (uVar65 & 1) == 0;
                          uVar65 = uVar65 >> 1 | 0x8000000000000000) {
                        uVar63 = uVar63 + 1;
                      }
                    }
                    bVar60 = 0;
LAB_0180918e:
                    auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar188 = ZEXT3264(auVar94);
                    auVar77 = vxorps_avx512vl(auVar77,auVar77);
                    auVar189 = ZEXT1664(auVar77);
                    auVar190 = ZEXT3264(local_4c0);
                    auVar191 = ZEXT3264(local_4a0);
                    auVar187 = ZEXT3264(local_600);
                    auVar186 = ZEXT3264(local_5e0);
                    auVar192 = ZEXT3264(local_580);
                    auVar194 = ZEXT3264(local_4e0);
                    auVar193 = ZEXT3264(local_5a0);
                    auVar195 = ZEXT3264(local_5c0);
                  }
                  bVar64 = (bool)(bVar64 | bVar60);
                }
              }
              goto LAB_0180916d;
            }
          }
          auVar187 = ZEXT3264(local_600);
          auVar186 = ZEXT3264(local_5e0);
        }
LAB_0180916d:
      }
    }
    if (bVar64) break;
    uVar128 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar27._4_4_ = uVar128;
    auVar27._0_4_ = uVar128;
    auVar27._8_4_ = uVar128;
    auVar27._12_4_ = uVar128;
    uVar24 = vcmpps_avx512vl(local_3d0,auVar27,2);
    local_508 = (ulong)((uint)uVar67 & (uint)uVar24);
  }
  return local_508 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }